

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx2::CurveNvIntersector1<4>::
     occluded_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int iVar21;
  long lVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [12];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  byte bVar66;
  undefined1 (*pauVar67) [32];
  uint uVar68;
  uint uVar69;
  int iVar70;
  ulong uVar71;
  uint uVar72;
  ulong uVar73;
  ulong uVar74;
  bool bVar75;
  bool bVar76;
  undefined4 uVar77;
  undefined8 uVar78;
  vint4 bi_2;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar101 [32];
  undefined1 auVar91 [16];
  undefined1 auVar102 [32];
  undefined1 auVar99 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  undefined1 auVar100 [32];
  undefined1 auVar105 [64];
  float fVar106;
  float fVar130;
  float fVar131;
  vint4 bi_1;
  undefined1 auVar137 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar136 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar175;
  vint4 ai_2;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar177;
  float fVar178;
  float fVar179;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar176;
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  vint4 ai;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [28];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar214;
  float fVar215;
  vint4 bi;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [32];
  vint4 ai_1;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [16];
  undefined1 auVar237 [32];
  undefined1 auVar236 [32];
  undefined1 auVar238 [64];
  undefined1 auVar240 [16];
  undefined1 auVar239 [16];
  undefined1 auVar241 [32];
  float fVar243;
  float fVar244;
  undefined1 auVar242 [64];
  float fVar245;
  float fVar250;
  float fVar251;
  undefined1 auVar246 [16];
  float fVar252;
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  float fVar253;
  float fVar254;
  float fVar255;
  undefined1 auVar249 [64];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_b54;
  int local_b04;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [16];
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  RTCFilterFunctionNArguments local_a10;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [48];
  undefined8 local_930;
  undefined4 local_928;
  float local_924;
  undefined4 local_920;
  undefined4 local_91c;
  uint local_918;
  uint local_914;
  uint local_910;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  undefined1 auStack_8b0 [16];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_850 [16];
  Primitive *local_838;
  Primitive *local_830;
  ulong local_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined4 local_7c0;
  undefined4 uStack_7bc;
  undefined4 uStack_7b8;
  undefined4 uStack_7b4;
  undefined4 uStack_7b0;
  undefined4 uStack_7ac;
  undefined4 uStack_7a8;
  undefined4 uStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  uint local_6a0;
  uint uStack_69c;
  uint uStack_698;
  uint uStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  uint uStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  PVar4 = prim[1];
  uVar71 = (ulong)(byte)PVar4;
  lVar22 = uVar71 * 0x19;
  fVar106 = *(float *)(prim + lVar22 + 0x12);
  auVar137 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar22 + 6));
  auVar79._0_4_ = fVar106 * auVar137._0_4_;
  auVar79._4_4_ = fVar106 * auVar137._4_4_;
  auVar79._8_4_ = fVar106 * auVar137._8_4_;
  auVar79._12_4_ = fVar106 * auVar137._12_4_;
  auVar198._0_4_ = fVar106 * (ray->dir).field_0.m128[0];
  auVar198._4_4_ = fVar106 * (ray->dir).field_0.m128[1];
  auVar198._8_4_ = fVar106 * (ray->dir).field_0.m128[2];
  auVar198._12_4_ = fVar106 * (ray->dir).field_0.m128[3];
  auVar137 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 4 + 6)));
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 5 + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar240 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 6 + 6)));
  auVar240 = vcvtdq2ps_avx(auVar240);
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xb + 6)));
  auVar204 = vcvtdq2ps_avx(auVar204);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar71 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  uVar74 = (ulong)(uint)((int)(uVar71 * 9) * 2);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar81 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 + uVar71 + 6)));
  auVar81 = vcvtdq2ps_avx(auVar81);
  uVar74 = (ulong)(uint)((int)(uVar71 * 5) << 2);
  auVar136 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar74 + 6)));
  auVar136 = vcvtdq2ps_avx(auVar136);
  auVar260._4_4_ = auVar198._0_4_;
  auVar260._0_4_ = auVar198._0_4_;
  auVar260._8_4_ = auVar198._0_4_;
  auVar260._12_4_ = auVar198._0_4_;
  auVar108 = vshufps_avx(auVar198,auVar198,0x55);
  auVar80 = vshufps_avx(auVar198,auVar198,0xaa);
  fVar106 = auVar80._0_4_;
  auVar246._0_4_ = fVar106 * auVar240._0_4_;
  fVar130 = auVar80._4_4_;
  auVar246._4_4_ = fVar130 * auVar240._4_4_;
  fVar131 = auVar80._8_4_;
  auVar246._8_4_ = fVar131 * auVar240._8_4_;
  fVar132 = auVar80._12_4_;
  auVar246._12_4_ = fVar132 * auVar240._12_4_;
  auVar239._0_4_ = auVar9._0_4_ * fVar106;
  auVar239._4_4_ = auVar9._4_4_ * fVar130;
  auVar239._8_4_ = auVar9._8_4_ * fVar131;
  auVar239._12_4_ = auVar9._12_4_ * fVar132;
  auVar228._0_4_ = auVar136._0_4_ * fVar106;
  auVar228._4_4_ = auVar136._4_4_ * fVar130;
  auVar228._8_4_ = auVar136._8_4_ * fVar131;
  auVar228._12_4_ = auVar136._12_4_ * fVar132;
  auVar80 = vfmadd231ps_fma(auVar246,auVar108,auVar88);
  auVar109 = vfmadd231ps_fma(auVar239,auVar108,auVar8);
  auVar108 = vfmadd231ps_fma(auVar228,auVar81,auVar108);
  auVar151 = vfmadd231ps_fma(auVar80,auVar260,auVar137);
  auVar249 = ZEXT1664(auVar151);
  auVar109 = vfmadd231ps_fma(auVar109,auVar260,auVar204);
  auVar242 = ZEXT1664(auVar109);
  auVar181 = vfmadd231ps_fma(auVar108,auVar82,auVar260);
  auVar261._4_4_ = auVar79._0_4_;
  auVar261._0_4_ = auVar79._0_4_;
  auVar261._8_4_ = auVar79._0_4_;
  auVar261._12_4_ = auVar79._0_4_;
  auVar108 = vshufps_avx(auVar79,auVar79,0x55);
  auVar80 = vshufps_avx(auVar79,auVar79,0xaa);
  fVar106 = auVar80._0_4_;
  auVar199._0_4_ = fVar106 * auVar240._0_4_;
  fVar130 = auVar80._4_4_;
  auVar199._4_4_ = fVar130 * auVar240._4_4_;
  fVar131 = auVar80._8_4_;
  auVar199._8_4_ = fVar131 * auVar240._8_4_;
  fVar132 = auVar80._12_4_;
  auVar199._12_4_ = fVar132 * auVar240._12_4_;
  auVar107._0_4_ = auVar9._0_4_ * fVar106;
  auVar107._4_4_ = auVar9._4_4_ * fVar130;
  auVar107._8_4_ = auVar9._8_4_ * fVar131;
  auVar107._12_4_ = auVar9._12_4_ * fVar132;
  auVar80._0_4_ = auVar136._0_4_ * fVar106;
  auVar80._4_4_ = auVar136._4_4_ * fVar130;
  auVar80._8_4_ = auVar136._8_4_ * fVar131;
  auVar80._12_4_ = auVar136._12_4_ * fVar132;
  auVar88 = vfmadd231ps_fma(auVar199,auVar108,auVar88);
  auVar240 = vfmadd231ps_fma(auVar107,auVar108,auVar8);
  auVar8 = vfmadd231ps_fma(auVar80,auVar108,auVar81);
  auVar9 = vfmadd231ps_fma(auVar88,auVar261,auVar137);
  auVar81 = vfmadd231ps_fma(auVar240,auVar261,auVar204);
  auVar136 = vfmadd231ps_fma(auVar8,auVar261,auVar82);
  local_a60._8_4_ = 0x7fffffff;
  local_a60._0_8_ = 0x7fffffff7fffffff;
  local_a60._12_4_ = 0x7fffffff;
  auVar137 = vandps_avx(auVar151,local_a60);
  auVar180._8_4_ = 0x219392ef;
  auVar180._0_8_ = 0x219392ef219392ef;
  auVar180._12_4_ = 0x219392ef;
  auVar137 = vcmpps_avx(auVar137,auVar180,1);
  auVar88 = vblendvps_avx(auVar151,auVar180,auVar137);
  auVar137 = vandps_avx(auVar109,local_a60);
  auVar137 = vcmpps_avx(auVar137,auVar180,1);
  auVar240 = vblendvps_avx(auVar109,auVar180,auVar137);
  auVar137 = vandps_avx(auVar181,local_a60);
  auVar137 = vcmpps_avx(auVar137,auVar180,1);
  auVar137 = vblendvps_avx(auVar181,auVar180,auVar137);
  auVar204 = vrcpps_avx(auVar88);
  auVar226._8_4_ = 0x3f800000;
  auVar226._0_8_ = 0x3f8000003f800000;
  auVar226._12_4_ = 0x3f800000;
  auVar88 = vfnmadd213ps_fma(auVar88,auVar204,auVar226);
  auVar204 = vfmadd132ps_fma(auVar88,auVar204,auVar204);
  auVar88 = vrcpps_avx(auVar240);
  auVar240 = vfnmadd213ps_fma(auVar240,auVar88,auVar226);
  auVar8 = vfmadd132ps_fma(auVar240,auVar88,auVar88);
  auVar88 = vrcpps_avx(auVar137);
  auVar137 = vfnmadd213ps_fma(auVar137,auVar88,auVar226);
  auVar82 = vfmadd132ps_fma(auVar137,auVar88,auVar88);
  auVar137._8_8_ = 0;
  auVar137._0_8_ = *(ulong *)(prim + uVar71 * 7 + 6);
  auVar137 = vpmovsxwd_avx(auVar137);
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar137 = vsubps_avx(auVar137,auVar9);
  auVar181._0_4_ = auVar204._0_4_ * auVar137._0_4_;
  auVar181._4_4_ = auVar204._4_4_ * auVar137._4_4_;
  auVar181._8_4_ = auVar204._8_4_ * auVar137._8_4_;
  auVar181._12_4_ = auVar204._12_4_ * auVar137._12_4_;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar71 * 9 + 6);
  auVar137 = vpmovsxwd_avx(auVar88);
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar137 = vsubps_avx(auVar137,auVar9);
  auVar200._0_4_ = auVar204._0_4_ * auVar137._0_4_;
  auVar200._4_4_ = auVar204._4_4_ * auVar137._4_4_;
  auVar200._8_4_ = auVar204._8_4_ * auVar137._8_4_;
  auVar200._12_4_ = auVar204._12_4_ * auVar137._12_4_;
  auVar109._1_3_ = 0;
  auVar109[0] = PVar4;
  auVar240._8_8_ = 0;
  auVar240._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar88 = vpmovsxwd_avx(auVar240);
  auVar204._8_8_ = 0;
  auVar204._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar71 * -2 + 6);
  auVar137 = vpmovsxwd_avx(auVar204);
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar137 = vsubps_avx(auVar137,auVar81);
  auVar229._0_4_ = auVar137._0_4_ * auVar8._0_4_;
  auVar229._4_4_ = auVar137._4_4_ * auVar8._4_4_;
  auVar229._8_4_ = auVar137._8_4_ * auVar8._8_4_;
  auVar229._12_4_ = auVar137._12_4_ * auVar8._12_4_;
  auVar137 = vcvtdq2ps_avx(auVar88);
  auVar137 = vsubps_avx(auVar137,auVar81);
  auVar108._0_4_ = auVar8._0_4_ * auVar137._0_4_;
  auVar108._4_4_ = auVar8._4_4_ * auVar137._4_4_;
  auVar108._8_4_ = auVar8._8_4_ * auVar137._8_4_;
  auVar108._12_4_ = auVar8._12_4_ * auVar137._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar74 + uVar71 + 6);
  auVar137 = vpmovsxwd_avx(auVar8);
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar137 = vsubps_avx(auVar137,auVar136);
  auVar151._0_4_ = auVar82._0_4_ * auVar137._0_4_;
  auVar151._4_4_ = auVar82._4_4_ * auVar137._4_4_;
  auVar151._8_4_ = auVar82._8_4_ * auVar137._8_4_;
  auVar151._12_4_ = auVar82._12_4_ * auVar137._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar71 * 0x17 + 6);
  auVar137 = vpmovsxwd_avx(auVar9);
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar137 = vsubps_avx(auVar137,auVar136);
  auVar81._0_4_ = auVar82._0_4_ * auVar137._0_4_;
  auVar81._4_4_ = auVar82._4_4_ * auVar137._4_4_;
  auVar81._8_4_ = auVar82._8_4_ * auVar137._8_4_;
  auVar81._12_4_ = auVar82._12_4_ * auVar137._12_4_;
  auVar137 = vpminsd_avx(auVar181,auVar200);
  auVar88 = vpminsd_avx(auVar229,auVar108);
  auVar137 = vmaxps_avx(auVar137,auVar88);
  auVar88 = vpminsd_avx(auVar151,auVar81);
  uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar235._4_4_ = uVar1;
  auVar235._0_4_ = uVar1;
  auVar235._8_4_ = uVar1;
  auVar235._12_4_ = uVar1;
  auVar88 = vmaxps_avx(auVar88,auVar235);
  auVar137 = vmaxps_avx(auVar137,auVar88);
  local_4e0._0_4_ = auVar137._0_4_ * 0.99999964;
  local_4e0._4_4_ = auVar137._4_4_ * 0.99999964;
  local_4e0._8_4_ = auVar137._8_4_ * 0.99999964;
  local_4e0._12_4_ = auVar137._12_4_ * 0.99999964;
  auVar137 = vpmaxsd_avx(auVar181,auVar200);
  auVar88 = vpmaxsd_avx(auVar229,auVar108);
  auVar137 = vminps_avx(auVar137,auVar88);
  auVar88 = vpmaxsd_avx(auVar151,auVar81);
  fVar106 = ray->tfar;
  auVar136._4_4_ = fVar106;
  auVar136._0_4_ = fVar106;
  auVar136._8_4_ = fVar106;
  auVar136._12_4_ = fVar106;
  auVar88 = vminps_avx(auVar88,auVar136);
  auVar137 = vminps_avx(auVar137,auVar88);
  auVar82._0_4_ = auVar137._0_4_ * 1.0000004;
  auVar82._4_4_ = auVar137._4_4_ * 1.0000004;
  auVar82._8_4_ = auVar137._8_4_ * 1.0000004;
  auVar82._12_4_ = auVar137._12_4_ * 1.0000004;
  auVar109[4] = PVar4;
  auVar109._5_3_ = 0;
  auVar109[8] = PVar4;
  auVar109._9_3_ = 0;
  auVar109[0xc] = PVar4;
  auVar109._13_3_ = 0;
  auVar88 = vpcmpgtd_avx(auVar109,_DAT_01f7fcf0);
  auVar137 = vcmpps_avx(local_4e0,auVar82,2);
  auVar137 = vandps_avx(auVar137,auVar88);
  uVar72 = vmovmskps_avx(auVar137);
  if (uVar72 == 0) {
    return false;
  }
  uVar72 = uVar72 & 0xff;
  local_838 = prim + lVar22 + 0x16;
  auVar93._16_16_ = mm_lookupmask_ps._240_16_;
  auVar93._0_16_ = mm_lookupmask_ps._240_16_;
  local_660 = vblendps_avx(auVar93,ZEXT832(0) << 0x20,0x80);
  local_7c0 = 0x7fffffff;
  uStack_7bc = 0x7fffffff;
  uStack_7b8 = 0x7fffffff;
  uStack_7b4 = 0x7fffffff;
  uStack_7b0 = 0x7fffffff;
  uStack_7ac = 0x7fffffff;
  uStack_7a8 = 0x7fffffff;
  uStack_7a4 = 0x7fffffff;
  local_6a0 = 0x80000000;
  uStack_69c = 0x80000000;
  uStack_698 = 0x80000000;
  uStack_694 = 0x80000000;
  fStack_690 = -0.0;
  fStack_68c = -0.0;
  fStack_688 = -0.0;
  uStack_684 = 0x80000000;
  local_830 = prim;
LAB_01588749:
  lVar22 = 0;
  local_828 = (ulong)uVar72;
  for (uVar71 = local_828; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
    lVar22 = lVar22 + 1;
  }
  local_828 = local_828 - 1 & local_828;
  uVar1 = *(undefined4 *)(local_830 + lVar22 * 4 + 6);
  uVar71 = (ulong)(uint)((int)lVar22 << 6);
  auVar137 = *(undefined1 (*) [16])(local_838 + uVar71);
  if (local_828 != 0) {
    uVar73 = local_828 - 1 & local_828;
    for (uVar74 = local_828; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
    }
    if (uVar73 != 0) {
      for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
      }
    }
  }
  uVar72 = *(uint *)(local_830 + 2);
  auVar88 = *(undefined1 (*) [16])(local_838 + uVar71 + 0x10);
  auVar240 = *(undefined1 (*) [16])(local_838 + uVar71 + 0x20);
  auVar204 = *(undefined1 (*) [16])(local_838 + uVar71 + 0x30);
  auVar201._0_4_ = (auVar137._0_4_ + auVar88._0_4_ + auVar240._0_4_ + auVar204._0_4_) * 0.25;
  auVar201._4_4_ = (auVar137._4_4_ + auVar88._4_4_ + auVar240._4_4_ + auVar204._4_4_) * 0.25;
  auVar201._8_4_ = (auVar137._8_4_ + auVar88._8_4_ + auVar240._8_4_ + auVar204._8_4_) * 0.25;
  auVar201._12_4_ = (auVar137._12_4_ + auVar88._12_4_ + auVar240._12_4_ + auVar204._12_4_) * 0.25;
  aVar2 = (ray->org).field_0;
  aVar3 = (ray->dir).field_0.field_1;
  auVar8 = vsubps_avx(auVar201,(undefined1  [16])aVar2);
  auVar8 = vdpps_avx(auVar8,(undefined1  [16])aVar3,0x7f);
  auVar9 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar82 = vrcpss_avx(auVar9,auVar9);
  auVar9 = vfnmadd213ss_fma(auVar82,auVar9,ZEXT416(0x40000000));
  fVar106 = auVar8._0_4_ * auVar82._0_4_ * auVar9._0_4_;
  local_850 = ZEXT416((uint)fVar106);
  auVar202._4_4_ = fVar106;
  auVar202._0_4_ = fVar106;
  auVar202._8_4_ = fVar106;
  auVar202._12_4_ = fVar106;
  fStack_870 = fVar106;
  _local_880 = auVar202;
  fStack_86c = fVar106;
  fStack_868 = fVar106;
  fStack_864 = fVar106;
  auVar8 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar202);
  auVar8 = vblendps_avx(auVar8,_DAT_01f7aa10,8);
  local_a20 = vsubps_avx(auVar137,auVar8);
  local_a30 = vsubps_avx(auVar240,auVar8);
  local_a40 = vsubps_avx(auVar88,auVar8);
  _local_a50 = vsubps_avx(auVar204,auVar8);
  auVar137 = vmovshdup_avx(local_a20);
  local_1e0 = auVar137._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar137 = vshufps_avx(local_a20,local_a20,0xaa);
  uVar78 = auVar137._0_8_;
  auVar143._8_8_ = uVar78;
  auVar143._0_8_ = uVar78;
  auVar143._16_8_ = uVar78;
  auVar143._24_8_ = uVar78;
  auVar137 = vshufps_avx(local_a20,local_a20,0xff);
  uVar78 = auVar137._0_8_;
  auVar256._8_8_ = uVar78;
  auVar256._0_8_ = uVar78;
  auVar256._16_8_ = uVar78;
  auVar256._24_8_ = uVar78;
  auVar137 = vmovshdup_avx(local_a40);
  local_200 = auVar137._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar137 = vshufps_avx(local_a40,local_a40,0xaa);
  uVar78 = auVar137._0_8_;
  local_a80._8_8_ = uVar78;
  local_a80._0_8_ = uVar78;
  local_a80._16_8_ = uVar78;
  local_a80._24_8_ = uVar78;
  auVar137 = vshufps_avx(local_a40,local_a40,0xff);
  local_220 = auVar137._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar137 = vmovshdup_avx(local_a30);
  uVar78 = auVar137._0_8_;
  local_b00._8_8_ = uVar78;
  local_b00._0_8_ = uVar78;
  local_b00._16_8_ = uVar78;
  local_b00._24_8_ = uVar78;
  auVar137 = vshufps_avx(local_a30,local_a30,0xaa);
  local_3c0 = auVar137._0_4_;
  fStack_3bc = auVar137._4_4_;
  auVar137 = vshufps_avx(local_a30,local_a30,0xff);
  local_3e0 = auVar137._0_4_;
  fStack_3dc = auVar137._4_4_;
  auVar137 = vmovshdup_avx(_local_a50);
  local_240 = auVar137._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar137 = vshufps_avx(_local_a50,_local_a50,0xaa);
  local_260 = auVar137._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar137 = vshufps_avx(_local_a50,_local_a50,0xff);
  local_280 = auVar137._0_8_;
  uStack_278 = local_280;
  uStack_270 = local_280;
  uStack_268 = local_280;
  auVar83._0_4_ = aVar3.x * aVar3.x;
  auVar83._4_4_ = aVar3.y * aVar3.y;
  auVar83._8_4_ = aVar3.z * aVar3.z;
  auVar83._12_4_ = aVar3.field_3.w * aVar3.field_3.w;
  auVar137 = vshufps_avx(auVar83,auVar83,0xaa);
  uVar77 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_7a0._4_4_ = uVar77;
  local_7a0._0_4_ = uVar77;
  fStack_798 = (float)uVar77;
  fStack_794 = (float)uVar77;
  fStack_790 = (float)uVar77;
  fStack_78c = (float)uVar77;
  fStack_788 = (float)uVar77;
  register0x0000125c = uVar77;
  uVar78 = auVar137._0_8_;
  auVar236._8_8_ = uVar78;
  auVar236._0_8_ = uVar78;
  auVar236._16_8_ = uVar78;
  auVar236._24_8_ = uVar78;
  auVar137 = vfmadd231ps_fma(auVar236,_local_7a0,_local_7a0);
  uVar77 = *(undefined4 *)&(ray->dir).field_0;
  local_520._4_4_ = uVar77;
  local_520._0_4_ = uVar77;
  fStack_518 = (float)uVar77;
  fStack_514 = (float)uVar77;
  fStack_510 = (float)uVar77;
  fStack_50c = (float)uVar77;
  fStack_508 = (float)uVar77;
  register0x0000121c = uVar77;
  auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),_local_520,_local_520);
  auVar238 = ZEXT1664(auVar137);
  local_b54 = 1;
  uVar71 = 0;
  bVar75 = false;
  local_540 = (ray->dir).field_0.m128[2];
  local_300._0_4_ = local_a20._0_4_;
  local_300._4_4_ = local_300._0_4_;
  local_300._8_4_ = local_300._0_4_;
  local_300._12_4_ = local_300._0_4_;
  local_300._16_4_ = local_300._0_4_;
  local_300._20_4_ = local_300._0_4_;
  local_300._24_4_ = local_300._0_4_;
  local_300._28_4_ = local_300._0_4_;
  uVar77 = local_a40._0_4_;
  local_320._4_4_ = uVar77;
  local_320._0_4_ = uVar77;
  local_320._8_4_ = uVar77;
  local_320._12_4_ = uVar77;
  local_320._16_4_ = uVar77;
  local_320._20_4_ = uVar77;
  local_320._24_4_ = uVar77;
  local_320._28_4_ = uVar77;
  uVar77 = local_a30._0_4_;
  local_340._4_4_ = uVar77;
  local_340._0_4_ = uVar77;
  local_340._8_4_ = uVar77;
  local_340._12_4_ = uVar77;
  local_340._16_4_ = uVar77;
  local_340._20_4_ = uVar77;
  local_340._24_4_ = uVar77;
  local_340._28_4_ = uVar77;
  local_2c0 = local_a50._0_4_;
  fStack_2bc = local_2c0;
  fStack_2b8 = local_2c0;
  fStack_2b4 = local_2c0;
  fStack_2b0 = local_2c0;
  fStack_2ac = local_2c0;
  fStack_2a8 = local_2c0;
  fStack_2a4 = local_2c0;
  auVar12._4_4_ = uStack_7bc;
  auVar12._0_4_ = local_7c0;
  auVar12._8_4_ = uStack_7b8;
  auVar12._12_4_ = uStack_7b4;
  auVar12._16_4_ = uStack_7b0;
  auVar12._20_4_ = uStack_7ac;
  auVar12._24_4_ = uStack_7a8;
  auVar12._28_4_ = uStack_7a4;
  local_440 = vandps_avx(ZEXT1632(auVar137),auVar12);
  local_4d0 = ZEXT816(0x3f80000000000000);
  local_2a0 = ZEXT1632(auVar137);
  local_400 = auVar143;
  local_420 = auVar256;
  fStack_53c = local_540;
  fStack_538 = local_540;
  fStack_534 = local_540;
  fStack_530 = local_540;
  fStack_52c = local_540;
  fStack_528 = local_540;
  fStack_524 = local_540;
  fStack_3d8 = local_3e0;
  fStack_3d4 = fStack_3dc;
  fStack_3d0 = local_3e0;
  fStack_3cc = fStack_3dc;
  fStack_3c8 = local_3e0;
  fStack_3c4 = fStack_3dc;
  fStack_3b8 = local_3c0;
  fStack_3b4 = fStack_3bc;
  fStack_3b0 = local_3c0;
  fStack_3ac = fStack_3bc;
  fStack_3a8 = local_3c0;
  fStack_3a4 = fStack_3bc;
  do {
    auVar189._8_4_ = 0x3f800000;
    auVar189._0_8_ = 0x3f8000003f800000;
    auVar189._12_4_ = 0x3f800000;
    auVar189._16_4_ = 0x3f800000;
    auVar189._20_4_ = 0x3f800000;
    iVar70 = (int)uVar71;
    auVar189._24_4_ = 0x3f800000;
    auVar189._28_4_ = 0x3f800000;
    auVar137 = vmovshdup_avx(local_4d0);
    auVar137 = vsubps_avx(auVar137,local_4d0);
    fVar106 = auVar137._0_4_;
    fVar135 = fVar106 * 0.04761905;
    local_740._0_4_ = local_4d0._0_4_;
    local_740._4_4_ = local_740._0_4_;
    local_740._8_4_ = local_740._0_4_;
    local_740._12_4_ = local_740._0_4_;
    local_740._16_4_ = local_740._0_4_;
    local_740._20_4_ = local_740._0_4_;
    local_740._24_4_ = local_740._0_4_;
    local_740._28_4_ = local_740._0_4_;
    local_760._4_4_ = fVar106;
    local_760._0_4_ = fVar106;
    local_760._8_4_ = fVar106;
    local_760._12_4_ = fVar106;
    local_760._16_4_ = fVar106;
    local_760._20_4_ = fVar106;
    local_760._24_4_ = fVar106;
    local_760._28_4_ = fVar106;
    auVar137 = vfmadd231ps_fma(local_740,local_760,_DAT_01faff20);
    auVar93 = vsubps_avx(auVar189,ZEXT1632(auVar137));
    fVar106 = auVar137._0_4_;
    auVar128._0_4_ = local_320._0_4_ * fVar106;
    fVar130 = auVar137._4_4_;
    auVar128._4_4_ = local_320._4_4_ * fVar130;
    fVar131 = auVar137._8_4_;
    auVar128._8_4_ = local_320._8_4_ * fVar131;
    fVar132 = auVar137._12_4_;
    auVar128._12_4_ = local_320._12_4_ * fVar132;
    auVar128._16_4_ = local_320._16_4_ * 0.0;
    auVar128._20_4_ = local_320._20_4_ * 0.0;
    auVar128._28_36_ = auVar249._28_36_;
    auVar128._24_4_ = local_320._24_4_ * 0.0;
    auVar63._8_8_ = uStack_1f8;
    auVar63._0_8_ = local_200;
    auVar63._16_8_ = uStack_1f0;
    auVar63._24_8_ = uStack_1e8;
    auVar249._0_4_ = (float)local_200 * fVar106;
    auVar249._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar130;
    auVar249._8_4_ = (float)uStack_1f8 * fVar131;
    auVar249._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar132;
    auVar249._16_4_ = (float)uStack_1f0 * 0.0;
    auVar249._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar249._28_36_ = auVar242._28_36_;
    auVar249._24_4_ = (float)uStack_1e8 * 0.0;
    auVar242._0_4_ = local_a80._0_4_ * fVar106;
    auVar242._4_4_ = local_a80._4_4_ * fVar130;
    auVar242._8_4_ = local_a80._8_4_ * fVar131;
    auVar242._12_4_ = local_a80._12_4_ * fVar132;
    auVar242._16_4_ = local_a80._16_4_ * 0.0;
    auVar242._20_4_ = local_a80._20_4_ * 0.0;
    auVar242._28_36_ = auVar238._28_36_;
    auVar242._24_4_ = local_a80._24_4_ * 0.0;
    auVar62._8_8_ = uStack_218;
    auVar62._0_8_ = local_220;
    auVar62._16_8_ = uStack_210;
    auVar62._24_8_ = uStack_208;
    auVar65._4_4_ = (float)((ulong)local_220 >> 0x20) * fVar130;
    auVar65._0_4_ = (float)local_220 * fVar106;
    auVar65._8_4_ = (float)uStack_218 * fVar131;
    auVar65._12_4_ = (float)((ulong)uStack_218 >> 0x20) * fVar132;
    auVar65._16_4_ = (float)uStack_210 * 0.0;
    auVar65._20_4_ = (float)((ulong)uStack_210 >> 0x20) * 0.0;
    auVar65._24_4_ = (float)uStack_208 * 0.0;
    auVar65._28_4_ = DAT_01faff20._28_4_;
    auVar137 = vfmadd231ps_fma(auVar128._0_32_,auVar93,local_300);
    auVar64._8_8_ = uStack_1d8;
    auVar64._0_8_ = local_1e0;
    auVar64._16_8_ = uStack_1d0;
    auVar64._24_8_ = uStack_1c8;
    auVar88 = vfmadd231ps_fma(auVar249._0_32_,auVar93,auVar64);
    auVar240 = vfmadd231ps_fma(auVar242._0_32_,auVar93,auVar143);
    auVar204 = vfmadd231ps_fma(auVar65,auVar93,auVar256);
    auVar170._4_4_ = local_340._4_4_ * fVar130;
    auVar170._0_4_ = local_340._0_4_ * fVar106;
    auVar170._8_4_ = local_340._8_4_ * fVar131;
    auVar170._12_4_ = local_340._12_4_ * fVar132;
    auVar170._16_4_ = local_340._16_4_ * 0.0;
    auVar170._20_4_ = local_340._20_4_ * 0.0;
    auVar170._24_4_ = local_340._24_4_ * 0.0;
    auVar170._28_4_ = local_300._28_4_;
    auVar13._4_4_ = local_b00._4_4_ * fVar130;
    auVar13._0_4_ = local_b00._0_4_ * fVar106;
    auVar13._8_4_ = local_b00._8_4_ * fVar131;
    auVar13._12_4_ = local_b00._12_4_ * fVar132;
    auVar13._16_4_ = local_b00._16_4_ * 0.0;
    auVar13._20_4_ = local_b00._20_4_ * 0.0;
    auVar13._24_4_ = local_b00._24_4_ * 0.0;
    auVar13._28_4_ = local_b00._28_4_;
    auVar144._4_4_ = fVar130 * fStack_3bc;
    auVar144._0_4_ = fVar106 * local_3c0;
    auVar144._8_4_ = fVar131 * fStack_3b8;
    auVar144._12_4_ = fVar132 * fStack_3b4;
    auVar144._16_4_ = fStack_3b0 * 0.0;
    auVar144._20_4_ = fStack_3ac * 0.0;
    auVar144._24_4_ = fStack_3a8 * 0.0;
    auVar144._28_4_ = 0x3f800000;
    auVar14._4_4_ = fVar130 * fStack_3dc;
    auVar14._0_4_ = fVar106 * local_3e0;
    auVar14._8_4_ = fVar131 * fStack_3d8;
    auVar14._12_4_ = fVar132 * fStack_3d4;
    auVar14._16_4_ = fStack_3d0 * 0.0;
    auVar14._20_4_ = fStack_3cc * 0.0;
    uVar77 = (undefined4)((ulong)uStack_1e8 >> 0x20);
    auVar14._24_4_ = fStack_3c8 * 0.0;
    auVar14._28_4_ = uVar77;
    auVar8 = vfmadd231ps_fma(auVar170,auVar93,local_320);
    auVar9 = vfmadd231ps_fma(auVar13,auVar93,auVar63);
    auVar82 = vfmadd231ps_fma(auVar144,auVar93,local_a80);
    auVar81 = vfmadd231ps_fma(auVar14,auVar93,auVar62);
    auVar15._4_4_ = fVar130 * fStack_2bc;
    auVar15._0_4_ = fVar106 * local_2c0;
    auVar15._8_4_ = fVar131 * fStack_2b8;
    auVar15._12_4_ = fVar132 * fStack_2b4;
    auVar15._16_4_ = fStack_2b0 * 0.0;
    auVar15._20_4_ = fStack_2ac * 0.0;
    auVar15._24_4_ = fStack_2a8 * 0.0;
    auVar15._28_4_ = (int)((ulong)uStack_208 >> 0x20);
    auVar17._4_4_ = fVar130 * local_240._4_4_;
    auVar17._0_4_ = fVar106 * (float)local_240;
    auVar17._8_4_ = fVar131 * (float)uStack_238;
    auVar17._12_4_ = fVar132 * uStack_238._4_4_;
    auVar17._16_4_ = (float)uStack_230 * 0.0;
    auVar17._20_4_ = uStack_230._4_4_ * 0.0;
    auVar17._24_4_ = (float)uStack_228 * 0.0;
    auVar17._28_4_ = auVar256._28_4_;
    auVar18._28_4_ = local_a80._28_4_;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(auVar8._12_4_ * fVar132,
                            CONCAT48(auVar8._8_4_ * fVar131,
                                     CONCAT44(auVar8._4_4_ * fVar130,auVar8._0_4_ * fVar106))));
    auVar137 = vfmadd231ps_fma(auVar18,auVar93,ZEXT1632(auVar137));
    auVar88 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar132 * auVar9._12_4_,
                                                 CONCAT48(fVar131 * auVar9._8_4_,
                                                          CONCAT44(fVar130 * auVar9._4_4_,
                                                                   fVar106 * auVar9._0_4_)))),
                              auVar93,ZEXT1632(auVar88));
    auVar240 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar132 * auVar82._12_4_,
                                                  CONCAT48(fVar131 * auVar82._8_4_,
                                                           CONCAT44(fVar130 * auVar82._4_4_,
                                                                    fVar106 * auVar82._0_4_)))),
                               auVar93,ZEXT1632(auVar240));
    auVar204 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar132 * auVar81._12_4_,
                                                  CONCAT48(fVar131 * auVar81._8_4_,
                                                           CONCAT44(fVar130 * auVar81._4_4_,
                                                                    fVar106 * auVar81._0_4_)))),
                               auVar93,ZEXT1632(auVar204));
    auVar19._4_4_ = fVar130 * local_260._4_4_;
    auVar19._0_4_ = fVar106 * (float)local_260;
    auVar19._8_4_ = fVar131 * (float)uStack_258;
    auVar19._12_4_ = fVar132 * uStack_258._4_4_;
    auVar19._16_4_ = (float)uStack_250 * 0.0;
    auVar19._20_4_ = uStack_250._4_4_ * 0.0;
    auVar19._24_4_ = (float)uStack_248 * 0.0;
    auVar19._28_4_ = local_320._28_4_;
    auVar136 = vfmadd231ps_fma(auVar15,auVar93,local_340);
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar136._12_4_ * fVar132,
                                                CONCAT48(auVar136._8_4_ * fVar131,
                                                         CONCAT44(auVar136._4_4_ * fVar130,
                                                                  auVar136._0_4_ * fVar106)))),
                             auVar93,ZEXT1632(auVar8));
    auVar230._0_4_ = fVar106 * (float)local_280;
    auVar230._4_4_ = fVar130 * local_280._4_4_;
    auVar230._8_4_ = fVar131 * (float)uStack_278;
    auVar230._12_4_ = fVar132 * uStack_278._4_4_;
    auVar230._16_4_ = (float)uStack_270 * 0.0;
    auVar230._20_4_ = uStack_270._4_4_ * 0.0;
    auVar230._24_4_ = (float)uStack_268 * 0.0;
    auVar230._28_4_ = 0;
    auVar136 = vfmadd231ps_fma(auVar17,auVar93,local_b00);
    auVar60._4_4_ = fStack_3bc;
    auVar60._0_4_ = local_3c0;
    auVar60._8_4_ = fStack_3b8;
    auVar60._12_4_ = fStack_3b4;
    auVar60._16_4_ = fStack_3b0;
    auVar60._20_4_ = fStack_3ac;
    auVar60._24_4_ = fStack_3a8;
    auVar60._28_4_ = fStack_3a4;
    auVar108 = vfmadd231ps_fma(auVar19,auVar93,auVar60);
    auVar59._4_4_ = fStack_3dc;
    auVar59._0_4_ = local_3e0;
    auVar59._8_4_ = fStack_3d8;
    auVar59._12_4_ = fStack_3d4;
    auVar59._16_4_ = fStack_3d0;
    auVar59._20_4_ = fStack_3cc;
    auVar59._24_4_ = fStack_3c8;
    auVar59._28_4_ = fStack_3c4;
    auVar80 = vfmadd231ps_fma(auVar230,auVar93,auVar59);
    auVar20._28_4_ = local_340._28_4_;
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(auVar80._12_4_ * fVar132,
                            CONCAT48(auVar80._8_4_ * fVar131,
                                     CONCAT44(auVar80._4_4_ * fVar130,auVar80._0_4_ * fVar106))));
    auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar136._12_4_ * fVar132,
                                                CONCAT48(auVar136._8_4_ * fVar131,
                                                         CONCAT44(auVar136._4_4_ * fVar130,
                                                                  auVar136._0_4_ * fVar106)))),
                             auVar93,ZEXT1632(auVar9));
    auVar82 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar132 * auVar108._12_4_,
                                                 CONCAT48(fVar131 * auVar108._8_4_,
                                                          CONCAT44(fVar130 * auVar108._4_4_,
                                                                   fVar106 * auVar108._0_4_)))),
                              auVar93,ZEXT1632(auVar82));
    auVar81 = vfmadd231ps_fma(auVar20,auVar93,ZEXT1632(auVar81));
    auVar94._28_4_ = local_b00._28_4_;
    auVar94._0_28_ =
         ZEXT1628(CONCAT412(auVar8._12_4_ * fVar132,
                            CONCAT48(auVar8._8_4_ * fVar131,
                                     CONCAT44(auVar8._4_4_ * fVar130,auVar8._0_4_ * fVar106))));
    auVar231._28_4_ = uVar77;
    auVar231._0_28_ =
         ZEXT1628(CONCAT412(fVar132 * auVar82._12_4_,
                            CONCAT48(fVar131 * auVar82._8_4_,
                                     CONCAT44(fVar130 * auVar82._4_4_,fVar106 * auVar82._0_4_))));
    auVar136 = vfmadd231ps_fma(auVar94,auVar93,ZEXT1632(auVar137));
    auVar108 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar9._12_4_ * fVar132,
                                                  CONCAT48(auVar9._8_4_ * fVar131,
                                                           CONCAT44(auVar9._4_4_ * fVar130,
                                                                    auVar9._0_4_ * fVar106)))),
                               auVar93,ZEXT1632(auVar88));
    auVar94 = ZEXT1632(auVar108);
    auVar108 = vfmadd231ps_fma(auVar231,auVar93,ZEXT1632(auVar240));
    auVar80 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar81._12_4_ * fVar132,
                                                 CONCAT48(auVar81._8_4_ * fVar131,
                                                          CONCAT44(auVar81._4_4_ * fVar130,
                                                                   auVar81._0_4_ * fVar106)))),
                              ZEXT1632(auVar204),auVar93);
    auVar256 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar137));
    auVar93 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar88));
    auVar143 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar240));
    auVar12 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar204));
    fVar197 = fVar135 * auVar256._0_4_ * 3.0;
    fVar214 = fVar135 * auVar256._4_4_ * 3.0;
    local_700._4_4_ = fVar214;
    local_700._0_4_ = fVar197;
    fVar215 = fVar135 * auVar256._8_4_ * 3.0;
    local_700._8_4_ = fVar215;
    fVar216 = fVar135 * auVar256._12_4_ * 3.0;
    local_700._12_4_ = fVar216;
    fVar217 = fVar135 * auVar256._16_4_ * 3.0;
    local_700._16_4_ = fVar217;
    fVar218 = fVar135 * auVar256._20_4_ * 3.0;
    local_700._20_4_ = fVar218;
    fVar219 = fVar135 * auVar256._24_4_ * 3.0;
    local_700._24_4_ = fVar219;
    local_700._28_4_ = 0x40400000;
    local_9a0._0_4_ = fVar135 * auVar93._0_4_ * 3.0;
    local_9a0._4_4_ = fVar135 * auVar93._4_4_ * 3.0;
    local_9a0._8_4_ = fVar135 * auVar93._8_4_ * 3.0;
    local_9a0._12_4_ = fVar135 * auVar93._12_4_ * 3.0;
    local_9a0._16_4_ = fVar135 * auVar93._16_4_ * 3.0;
    local_9a0._20_4_ = fVar135 * auVar93._20_4_ * 3.0;
    local_9a0._24_4_ = fVar135 * auVar93._24_4_ * 3.0;
    local_9a0._28_4_ = 0;
    local_aa0._0_4_ = fVar135 * auVar143._0_4_ * 3.0;
    local_aa0._4_4_ = fVar135 * auVar143._4_4_ * 3.0;
    local_aa0._8_4_ = fVar135 * auVar143._8_4_ * 3.0;
    local_aa0._12_4_ = fVar135 * auVar143._12_4_ * 3.0;
    local_aa0._16_4_ = fVar135 * auVar143._16_4_ * 3.0;
    local_aa0._20_4_ = fVar135 * auVar143._20_4_ * 3.0;
    local_aa0._24_4_ = fVar135 * auVar143._24_4_ * 3.0;
    local_aa0._28_4_ = 0;
    fVar106 = fVar135 * auVar12._0_4_ * 3.0;
    fVar130 = fVar135 * auVar12._4_4_ * 3.0;
    auVar169._4_4_ = fVar130;
    auVar169._0_4_ = fVar106;
    fVar131 = fVar135 * auVar12._8_4_ * 3.0;
    auVar169._8_4_ = fVar131;
    fVar132 = fVar135 * auVar12._12_4_ * 3.0;
    auVar169._12_4_ = fVar132;
    fVar133 = fVar135 * auVar12._16_4_ * 3.0;
    auVar169._16_4_ = fVar133;
    fVar134 = fVar135 * auVar12._20_4_ * 3.0;
    auVar169._20_4_ = fVar134;
    fVar135 = fVar135 * auVar12._24_4_ * 3.0;
    auVar169._24_4_ = fVar135;
    auVar169._28_4_ = auVar256._28_4_;
    local_ae0 = ZEXT1632(auVar136);
    auVar17 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar136));
    auVar18 = vpermps_avx2(_DAT_01fec480,auVar94);
    local_980 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar108));
    auVar236 = vsubps_avx(auVar17,local_ae0);
    auVar170 = vsubps_avx(local_980,ZEXT1632(auVar108));
    fVar175 = auVar170._0_4_;
    fVar176 = auVar170._4_4_;
    auVar263._4_4_ = fVar176 * fVar214;
    auVar263._0_4_ = fVar175 * fVar197;
    fVar197 = auVar170._8_4_;
    auVar263._8_4_ = fVar197 * fVar215;
    fVar214 = auVar170._12_4_;
    auVar263._12_4_ = fVar214 * fVar216;
    fVar215 = auVar170._16_4_;
    auVar263._16_4_ = fVar215 * fVar217;
    fVar216 = auVar170._20_4_;
    auVar263._20_4_ = fVar216 * fVar218;
    fVar217 = auVar170._24_4_;
    auVar263._24_4_ = fVar217 * fVar219;
    auVar263._28_4_ = auVar17._28_4_;
    auVar137 = vfmsub231ps_fma(auVar263,local_aa0,auVar236);
    auVar13 = vsubps_avx(auVar18,auVar94);
    fVar218 = auVar236._0_4_;
    fVar219 = auVar236._4_4_;
    auVar168._4_4_ = fVar219 * local_9a0._4_4_;
    auVar168._0_4_ = fVar218 * (float)local_9a0._0_4_;
    fVar177 = auVar236._8_4_;
    auVar168._8_4_ = fVar177 * local_9a0._8_4_;
    fVar178 = auVar236._12_4_;
    auVar168._12_4_ = fVar178 * local_9a0._12_4_;
    fVar179 = auVar236._16_4_;
    auVar168._16_4_ = fVar179 * local_9a0._16_4_;
    fVar243 = auVar236._20_4_;
    auVar168._20_4_ = fVar243 * local_9a0._20_4_;
    fVar244 = auVar236._24_4_;
    auVar168._24_4_ = fVar244 * local_9a0._24_4_;
    auVar168._28_4_ = auVar18._28_4_;
    auVar88 = vfmsub231ps_fma(auVar168,local_700,auVar13);
    auVar10._28_4_ = local_980._28_4_;
    auVar10._0_28_ =
         ZEXT1628(CONCAT412(auVar88._12_4_ * auVar88._12_4_,
                            CONCAT48(auVar88._8_4_ * auVar88._8_4_,
                                     CONCAT44(auVar88._4_4_ * auVar88._4_4_,
                                              auVar88._0_4_ * auVar88._0_4_))));
    auVar137 = vfmadd231ps_fma(auVar10,ZEXT1632(auVar137),ZEXT1632(auVar137));
    fVar245 = auVar13._0_4_;
    auVar95._0_4_ = fVar245 * (float)local_aa0._0_4_;
    fVar250 = auVar13._4_4_;
    auVar95._4_4_ = fVar250 * local_aa0._4_4_;
    fVar251 = auVar13._8_4_;
    auVar95._8_4_ = fVar251 * local_aa0._8_4_;
    fVar252 = auVar13._12_4_;
    auVar95._12_4_ = fVar252 * local_aa0._12_4_;
    fVar253 = auVar13._16_4_;
    auVar95._16_4_ = fVar253 * local_aa0._16_4_;
    fVar254 = auVar13._20_4_;
    auVar95._20_4_ = fVar254 * local_aa0._20_4_;
    fVar255 = auVar13._24_4_;
    auVar95._24_4_ = fVar255 * local_aa0._24_4_;
    auVar95._28_4_ = 0;
    auVar240 = vfmsub231ps_fma(auVar95,local_9a0,auVar170);
    auVar142._0_4_ = fVar175 * fVar175;
    auVar142._4_4_ = fVar176 * fVar176;
    auVar142._8_4_ = fVar197 * fVar197;
    auVar142._12_4_ = fVar214 * fVar214;
    auVar142._16_4_ = fVar215 * fVar215;
    auVar142._20_4_ = fVar216 * fVar216;
    auVar142._24_4_ = fVar217 * fVar217;
    auVar142._28_4_ = 0;
    auVar88 = vfmadd231ps_fma(auVar142,auVar13,auVar13);
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar236,auVar236);
    auVar93 = vrcpps_avx(ZEXT1632(auVar88));
    auVar240 = vfmadd231ps_fma(ZEXT1632(auVar137),ZEXT1632(auVar240),ZEXT1632(auVar240));
    auVar257._8_4_ = 0x3f800000;
    auVar257._0_8_ = 0x3f8000003f800000;
    auVar257._12_4_ = 0x3f800000;
    auVar257._16_4_ = 0x3f800000;
    auVar257._20_4_ = 0x3f800000;
    auVar257._24_4_ = 0x3f800000;
    auVar257._28_4_ = 0x3f800000;
    auVar137 = vfnmadd213ps_fma(auVar93,ZEXT1632(auVar88),auVar257);
    auVar137 = vfmadd132ps_fma(ZEXT1632(auVar137),auVar93,auVar93);
    local_ac0 = vpermps_avx2(_DAT_01fec480,local_700);
    local_8e0 = vpermps_avx2(_DAT_01fec480,local_aa0);
    auVar11._4_4_ = local_ac0._4_4_ * fVar176;
    auVar11._0_4_ = local_ac0._0_4_ * fVar175;
    auVar11._8_4_ = local_ac0._8_4_ * fVar197;
    auVar11._12_4_ = local_ac0._12_4_ * fVar214;
    auVar11._16_4_ = local_ac0._16_4_ * fVar215;
    auVar11._20_4_ = local_ac0._20_4_ * fVar216;
    auVar11._24_4_ = local_ac0._24_4_ * fVar217;
    auVar11._28_4_ = auVar93._28_4_;
    auVar204 = vfmsub231ps_fma(auVar11,local_8e0,auVar236);
    local_720 = vpermps_avx2(_DAT_01fec480,local_9a0);
    auVar16._4_4_ = fVar219 * local_720._4_4_;
    auVar16._0_4_ = fVar218 * local_720._0_4_;
    auVar16._8_4_ = fVar177 * local_720._8_4_;
    auVar16._12_4_ = fVar178 * local_720._12_4_;
    auVar16._16_4_ = fVar179 * local_720._16_4_;
    auVar16._20_4_ = fVar243 * local_720._20_4_;
    auVar16._24_4_ = fVar244 * local_720._24_4_;
    auVar16._28_4_ = 0x40400000;
    auVar8 = vfmsub231ps_fma(auVar16,local_ac0,auVar13);
    auVar204 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar8._12_4_ * auVar8._12_4_,
                                                  CONCAT48(auVar8._8_4_ * auVar8._8_4_,
                                                           CONCAT44(auVar8._4_4_ * auVar8._4_4_,
                                                                    auVar8._0_4_ * auVar8._0_4_)))),
                               ZEXT1632(auVar204),ZEXT1632(auVar204));
    auVar190._0_4_ = fVar245 * local_8e0._0_4_;
    auVar190._4_4_ = fVar250 * local_8e0._4_4_;
    auVar190._8_4_ = fVar251 * local_8e0._8_4_;
    auVar190._12_4_ = fVar252 * local_8e0._12_4_;
    auVar190._16_4_ = fVar253 * local_8e0._16_4_;
    auVar190._20_4_ = fVar254 * local_8e0._20_4_;
    auVar190._24_4_ = fVar255 * local_8e0._24_4_;
    auVar190._28_4_ = 0;
    auVar8 = vfmsub231ps_fma(auVar190,local_720,auVar170);
    auVar204 = vfmadd231ps_fma(ZEXT1632(auVar204),ZEXT1632(auVar8),ZEXT1632(auVar8));
    auVar93 = vmaxps_avx(ZEXT1632(CONCAT412(auVar240._12_4_ * auVar137._12_4_,
                                            CONCAT48(auVar240._8_4_ * auVar137._8_4_,
                                                     CONCAT44(auVar240._4_4_ * auVar137._4_4_,
                                                              auVar240._0_4_ * auVar137._0_4_)))),
                         ZEXT1632(CONCAT412(auVar204._12_4_ * auVar137._12_4_,
                                            CONCAT48(auVar204._8_4_ * auVar137._8_4_,
                                                     CONCAT44(auVar204._4_4_ * auVar137._4_4_,
                                                              auVar204._0_4_ * auVar137._0_4_)))));
    auVar166._0_4_ = auVar80._0_4_ + fVar106;
    auVar166._4_4_ = auVar80._4_4_ + fVar130;
    auVar166._8_4_ = auVar80._8_4_ + fVar131;
    auVar166._12_4_ = auVar80._12_4_ + fVar132;
    auVar166._16_4_ = fVar133 + 0.0;
    auVar166._20_4_ = fVar134 + 0.0;
    auVar166._24_4_ = fVar135 + 0.0;
    auVar166._28_4_ = auVar256._28_4_ + 0.0;
    auVar231 = ZEXT1632(auVar80);
    local_780._16_16_ = (undefined1  [16])0x0;
    auVar256 = vsubps_avx(auVar231,auVar169);
    auVar19 = vpermps_avx2(_DAT_01fec480,auVar256);
    auVar20 = vpermps_avx2(_DAT_01fec480,auVar231);
    auVar256 = vmaxps_avx(auVar231,auVar166);
    auVar143 = vmaxps_avx(auVar19,auVar20);
    auVar12 = vrsqrtps_avx(ZEXT1632(auVar88));
    auVar256 = vmaxps_avx(auVar256,auVar143);
    fVar106 = auVar12._0_4_;
    fVar130 = auVar12._4_4_;
    fVar131 = auVar12._8_4_;
    fVar132 = auVar12._12_4_;
    fVar135 = auVar12._16_4_;
    fVar133 = auVar12._20_4_;
    fVar134 = auVar12._24_4_;
    auVar23._4_4_ = fVar130 * fVar130 * fVar130 * auVar88._4_4_ * -0.5;
    auVar23._0_4_ = fVar106 * fVar106 * fVar106 * auVar88._0_4_ * -0.5;
    auVar23._8_4_ = fVar131 * fVar131 * fVar131 * auVar88._8_4_ * -0.5;
    auVar23._12_4_ = fVar132 * fVar132 * fVar132 * auVar88._12_4_ * -0.5;
    auVar23._16_4_ = fVar135 * fVar135 * fVar135 * -0.0;
    auVar23._20_4_ = fVar133 * fVar133 * fVar133 * -0.0;
    auVar23._24_4_ = fVar134 * fVar134 * fVar134 * -0.0;
    auVar23._28_4_ = 0;
    auVar96._8_4_ = 0x3fc00000;
    auVar96._0_8_ = 0x3fc000003fc00000;
    auVar96._12_4_ = 0x3fc00000;
    auVar96._16_4_ = 0x3fc00000;
    auVar96._20_4_ = 0x3fc00000;
    auVar96._24_4_ = 0x3fc00000;
    auVar96._28_4_ = 0x3fc00000;
    auVar137 = vfmadd231ps_fma(auVar23,auVar96,auVar12);
    fVar130 = auVar137._0_4_;
    fVar131 = auVar137._4_4_;
    auVar24._4_4_ = fVar250 * fVar131;
    auVar24._0_4_ = fVar245 * fVar130;
    fVar135 = auVar137._8_4_;
    auVar24._8_4_ = fVar251 * fVar135;
    fVar134 = auVar137._12_4_;
    auVar24._12_4_ = fVar252 * fVar134;
    auVar24._16_4_ = fVar253 * 0.0;
    auVar24._20_4_ = fVar254 * 0.0;
    auVar24._24_4_ = fVar255 * 0.0;
    auVar24._28_4_ = 0x3fc00000;
    auVar262._0_4_ = local_540 * fVar175 * fVar130;
    auVar262._4_4_ = fStack_53c * fVar176 * fVar131;
    auVar262._8_4_ = fStack_538 * fVar197 * fVar135;
    auVar262._12_4_ = fStack_534 * fVar214 * fVar134;
    auVar262._16_4_ = fStack_530 * fVar215 * 0.0;
    auVar262._20_4_ = fStack_52c * fVar216 * 0.0;
    auVar262._24_4_ = fStack_528 * fVar217 * 0.0;
    auVar262._28_4_ = 0;
    auVar88 = vfmadd231ps_fma(auVar262,auVar24,_local_7a0);
    auVar263 = ZEXT1632(auVar108);
    local_900 = vsubps_avx(ZEXT832(0) << 0x20,auVar263);
    fVar245 = local_900._0_4_;
    fVar250 = local_900._4_4_;
    auVar25._4_4_ = fVar250 * fVar176 * fVar131;
    auVar25._0_4_ = fVar245 * fVar175 * fVar130;
    fVar175 = local_900._8_4_;
    auVar25._8_4_ = fVar175 * fVar197 * fVar135;
    fVar176 = local_900._12_4_;
    auVar25._12_4_ = fVar176 * fVar214 * fVar134;
    fVar251 = local_900._16_4_;
    auVar25._16_4_ = fVar251 * fVar215 * 0.0;
    fVar252 = local_900._20_4_;
    auVar25._20_4_ = fVar252 * fVar216 * 0.0;
    fVar253 = local_900._24_4_;
    auVar25._24_4_ = fVar253 * fVar217 * 0.0;
    auVar25._28_4_ = auVar170._28_4_;
    auVar12 = vsubps_avx(ZEXT832(0) << 0x20,auVar94);
    auVar240 = vfmadd231ps_fma(auVar25,auVar12,auVar24);
    auVar26._4_4_ = fVar219 * fVar131;
    auVar26._0_4_ = fVar218 * fVar130;
    auVar26._8_4_ = fVar177 * fVar135;
    auVar26._12_4_ = fVar178 * fVar134;
    auVar26._16_4_ = fVar179 * 0.0;
    auVar26._20_4_ = fVar243 * 0.0;
    auVar26._24_4_ = fVar244 * 0.0;
    auVar26._28_4_ = 0x3fc00000;
    auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar26,_local_520);
    auVar144 = vsubps_avx(ZEXT832(0) << 0x20,local_ae0);
    auVar249 = ZEXT3264(auVar144);
    auVar240 = vfmadd231ps_fma(ZEXT1632(auVar240),auVar144,auVar26);
    auVar27._4_4_ = fStack_53c * fVar250;
    auVar27._0_4_ = local_540 * fVar245;
    auVar27._8_4_ = fStack_538 * fVar175;
    auVar27._12_4_ = fStack_534 * fVar176;
    auVar27._16_4_ = fStack_530 * fVar251;
    auVar27._20_4_ = fStack_52c * fVar252;
    auVar27._24_4_ = fStack_528 * fVar253;
    auVar27._28_4_ = 0x3fc00000;
    auVar204 = vfmadd231ps_fma(auVar27,_local_7a0,auVar12);
    auVar204 = vfmadd231ps_fma(ZEXT1632(auVar204),_local_520,auVar144);
    fVar106 = auVar240._0_4_;
    fVar217 = auVar88._0_4_;
    fVar132 = auVar240._4_4_;
    fVar218 = auVar88._4_4_;
    fVar133 = auVar240._8_4_;
    fVar219 = auVar88._8_4_;
    fVar197 = auVar240._12_4_;
    fVar177 = auVar88._12_4_;
    auVar14 = vsubps_avx(ZEXT1632(auVar204),
                         ZEXT1632(CONCAT412(fVar177 * fVar197,
                                            CONCAT48(fVar219 * fVar133,
                                                     CONCAT44(fVar218 * fVar132,fVar217 * fVar106)))
                                 ));
    auVar28._4_4_ = fVar250 * fVar250;
    auVar28._0_4_ = fVar245 * fVar245;
    auVar28._8_4_ = fVar175 * fVar175;
    auVar28._12_4_ = fVar176 * fVar176;
    auVar28._16_4_ = fVar251 * fVar251;
    auVar28._20_4_ = fVar252 * fVar252;
    auVar28._24_4_ = fVar253 * fVar253;
    auVar28._28_4_ = 0;
    auVar204 = vfmadd231ps_fma(auVar28,auVar12,auVar12);
    auVar204 = vfmadd231ps_fma(ZEXT1632(auVar204),auVar144,auVar144);
    auVar29._28_4_ = local_520._28_4_;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(fVar197 * fVar197,
                            CONCAT48(fVar133 * fVar133,CONCAT44(fVar132 * fVar132,fVar106 * fVar106)
                                    )));
    auVar15 = vsubps_avx(ZEXT1632(auVar204),auVar29);
    auVar143 = vsqrtps_avx(auVar93);
    fVar106 = (auVar143._0_4_ + auVar256._0_4_) * 1.0000002;
    fVar132 = (auVar143._4_4_ + auVar256._4_4_) * 1.0000002;
    fVar133 = (auVar143._8_4_ + auVar256._8_4_) * 1.0000002;
    fVar197 = (auVar143._12_4_ + auVar256._12_4_) * 1.0000002;
    fVar214 = (auVar143._16_4_ + auVar256._16_4_) * 1.0000002;
    fVar215 = (auVar143._20_4_ + auVar256._20_4_) * 1.0000002;
    fVar216 = (auVar143._24_4_ + auVar256._24_4_) * 1.0000002;
    auVar30._4_4_ = fVar132 * fVar132;
    auVar30._0_4_ = fVar106 * fVar106;
    auVar30._8_4_ = fVar133 * fVar133;
    auVar30._12_4_ = fVar197 * fVar197;
    auVar30._16_4_ = fVar214 * fVar214;
    auVar30._20_4_ = fVar215 * fVar215;
    auVar30._24_4_ = fVar216 * fVar216;
    auVar30._28_4_ = auVar143._28_4_ + auVar256._28_4_;
    auVar237._0_4_ = auVar14._0_4_ + auVar14._0_4_;
    auVar237._4_4_ = auVar14._4_4_ + auVar14._4_4_;
    auVar237._8_4_ = auVar14._8_4_ + auVar14._8_4_;
    auVar237._12_4_ = auVar14._12_4_ + auVar14._12_4_;
    auVar237._16_4_ = auVar14._16_4_ + auVar14._16_4_;
    auVar237._20_4_ = auVar14._20_4_ + auVar14._20_4_;
    auVar237._24_4_ = auVar14._24_4_ + auVar14._24_4_;
    auVar237._28_4_ = auVar14._28_4_ + auVar14._28_4_;
    auVar238 = ZEXT3264(auVar237);
    auVar256 = vsubps_avx(auVar15,auVar30);
    auVar169 = ZEXT1632(auVar88);
    local_8a0._28_4_ = fStack_524;
    local_8a0._0_28_ =
         ZEXT1628(CONCAT412(fVar177 * fVar177,
                            CONCAT48(fVar219 * fVar219,CONCAT44(fVar218 * fVar218,fVar217 * fVar217)
                                    )));
    _local_620 = vsubps_avx(local_2a0,local_8a0);
    auVar31._4_4_ = auVar237._4_4_ * auVar237._4_4_;
    auVar31._0_4_ = auVar237._0_4_ * auVar237._0_4_;
    auVar31._8_4_ = auVar237._8_4_ * auVar237._8_4_;
    auVar31._12_4_ = auVar237._12_4_ * auVar237._12_4_;
    auVar31._16_4_ = auVar237._16_4_ * auVar237._16_4_;
    auVar31._20_4_ = auVar237._20_4_ * auVar237._20_4_;
    auVar31._24_4_ = auVar237._24_4_ * auVar237._24_4_;
    auVar31._28_4_ = 0x3f800002;
    fVar132 = local_620._0_4_;
    fVar133 = local_620._4_4_;
    fVar197 = local_620._8_4_;
    fVar214 = local_620._12_4_;
    fVar215 = local_620._16_4_;
    fVar216 = local_620._20_4_;
    fVar217 = local_620._24_4_;
    auVar32._4_4_ = fVar133 * 4.0 * auVar256._4_4_;
    auVar32._0_4_ = fVar132 * 4.0 * auVar256._0_4_;
    auVar32._8_4_ = fVar197 * 4.0 * auVar256._8_4_;
    auVar32._12_4_ = fVar214 * 4.0 * auVar256._12_4_;
    auVar32._16_4_ = fVar215 * 4.0 * auVar256._16_4_;
    auVar32._20_4_ = fVar216 * 4.0 * auVar256._20_4_;
    auVar32._24_4_ = fVar217 * 4.0 * auVar256._24_4_;
    auVar32._28_4_ = 0x40800000;
    auVar14 = vsubps_avx(auVar31,auVar32);
    auVar93 = vcmpps_avx(auVar14,ZEXT432(0) << 0x20,5);
    local_2e0 = ZEXT1632(auVar137);
    local_9c0 = ZEXT1632(auVar240);
    fVar106 = local_620._28_4_;
    if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar93 >> 0x7f,0) == '\0') &&
          (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar93 >> 0xbf,0) == '\0') &&
        (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar93[0x1f]) {
      auVar264._8_4_ = 0x7f800000;
      auVar264._0_8_ = 0x7f8000007f800000;
      auVar264._12_4_ = 0x7f800000;
      auVar264._16_4_ = 0x7f800000;
      auVar264._20_4_ = 0x7f800000;
      auVar264._24_4_ = 0x7f800000;
      auVar264._28_4_ = 0x7f800000;
      auVar191._8_4_ = 0xff800000;
      auVar191._0_8_ = 0xff800000ff800000;
      auVar191._12_4_ = 0xff800000;
      auVar191._16_4_ = 0xff800000;
      auVar191._20_4_ = 0xff800000;
      auVar191._24_4_ = 0xff800000;
      auVar191._28_4_ = 0xff800000;
      auVar7 = local_2a0;
    }
    else {
      auVar11 = vsqrtps_avx(auVar14);
      auVar265._0_4_ = fVar132 + fVar132;
      auVar265._4_4_ = fVar133 + fVar133;
      auVar265._8_4_ = fVar197 + fVar197;
      auVar265._12_4_ = fVar214 + fVar214;
      auVar265._16_4_ = fVar215 + fVar215;
      auVar265._20_4_ = fVar216 + fVar216;
      auVar265._24_4_ = fVar217 + fVar217;
      auVar265._28_4_ = fVar106 + fVar106;
      auVar10 = vrcpps_avx(auVar265);
      auVar168 = vcmpps_avx(auVar14,ZEXT432(0) << 0x20,5);
      auVar192._8_4_ = 0x3f800000;
      auVar192._0_8_ = 0x3f8000003f800000;
      auVar192._12_4_ = 0x3f800000;
      auVar192._16_4_ = 0x3f800000;
      auVar192._20_4_ = 0x3f800000;
      auVar192._24_4_ = 0x3f800000;
      auVar192._28_4_ = 0x3f800000;
      auVar137 = vfnmadd213ps_fma(auVar265,auVar10,auVar192);
      auVar137 = vfmadd132ps_fma(ZEXT1632(auVar137),auVar10,auVar10);
      auVar193._0_4_ = (uint)auVar237._0_4_ ^ local_6a0;
      auVar193._4_4_ = (uint)auVar237._4_4_ ^ uStack_69c;
      auVar193._8_4_ = (uint)auVar237._8_4_ ^ uStack_698;
      auVar193._12_4_ = (uint)auVar237._12_4_ ^ uStack_694;
      auVar193._16_4_ = (uint)auVar237._16_4_ ^ (uint)fStack_690;
      auVar193._20_4_ = (uint)auVar237._20_4_ ^ (uint)fStack_68c;
      auVar193._24_4_ = (uint)auVar237._24_4_ ^ (uint)fStack_688;
      auVar193._28_4_ = (uint)auVar237._28_4_ ^ uStack_684;
      auVar16 = vsubps_avx(auVar193,auVar11);
      auVar33._4_4_ = auVar137._4_4_ * auVar16._4_4_;
      auVar33._0_4_ = auVar137._0_4_ * auVar16._0_4_;
      auVar33._8_4_ = auVar137._8_4_ * auVar16._8_4_;
      auVar33._12_4_ = auVar137._12_4_ * auVar16._12_4_;
      auVar33._16_4_ = auVar16._16_4_ * 0.0;
      auVar33._20_4_ = auVar16._20_4_ * 0.0;
      auVar33._24_4_ = auVar16._24_4_ * 0.0;
      auVar33._28_4_ = auVar16._28_4_;
      auVar14 = vsubps_avx(auVar11,auVar237);
      auVar34._4_4_ = auVar137._4_4_ * auVar14._4_4_;
      auVar34._0_4_ = auVar137._0_4_ * auVar14._0_4_;
      auVar34._8_4_ = auVar137._8_4_ * auVar14._8_4_;
      auVar34._12_4_ = auVar137._12_4_ * auVar14._12_4_;
      auVar34._16_4_ = auVar14._16_4_ * 0.0;
      auVar34._20_4_ = auVar14._20_4_ * 0.0;
      auVar34._24_4_ = auVar14._24_4_ * 0.0;
      auVar34._28_4_ = auVar10._28_4_;
      auVar137 = vfmadd213ps_fma(auVar169,auVar33,local_9c0);
      local_360 = ZEXT1632(CONCAT412(fVar134 * auVar137._12_4_,
                                     CONCAT48(fVar135 * auVar137._8_4_,
                                              CONCAT44(fVar131 * auVar137._4_4_,
                                                       fVar130 * auVar137._0_4_))));
      auVar7._4_4_ = uStack_7bc;
      auVar7._0_4_ = local_7c0;
      auVar7._8_4_ = uStack_7b8;
      auVar7._12_4_ = uStack_7b4;
      auVar7._16_4_ = uStack_7b0;
      auVar7._20_4_ = uStack_7ac;
      auVar7._24_4_ = uStack_7a8;
      auVar7._28_4_ = uStack_7a4;
      auVar14 = vandps_avx(local_8a0,auVar7);
      auVar14 = vmaxps_avx(local_440,auVar14);
      auVar35._4_4_ = auVar14._4_4_ * 1.9073486e-06;
      auVar35._0_4_ = auVar14._0_4_ * 1.9073486e-06;
      auVar35._8_4_ = auVar14._8_4_ * 1.9073486e-06;
      auVar35._12_4_ = auVar14._12_4_ * 1.9073486e-06;
      auVar35._16_4_ = auVar14._16_4_ * 1.9073486e-06;
      auVar35._20_4_ = auVar14._20_4_ * 1.9073486e-06;
      auVar35._24_4_ = auVar14._24_4_ * 1.9073486e-06;
      auVar35._28_4_ = auVar14._28_4_;
      auVar14 = vandps_avx(_local_620,auVar7);
      auVar14 = vcmpps_avx(auVar14,auVar35,1);
      auVar238 = ZEXT3264(auVar169);
      auVar137 = vfmadd213ps_fma(auVar169,auVar34,local_9c0);
      auVar232._8_4_ = 0x7f800000;
      auVar232._0_8_ = 0x7f8000007f800000;
      auVar232._12_4_ = 0x7f800000;
      auVar232._16_4_ = 0x7f800000;
      auVar232._20_4_ = 0x7f800000;
      auVar232._24_4_ = 0x7f800000;
      auVar232._28_4_ = 0x7f800000;
      auVar264 = vblendvps_avx(auVar232,auVar33,auVar168);
      local_380 = auVar137._0_4_ * fVar130;
      fStack_37c = auVar137._4_4_ * fVar131;
      fStack_378 = auVar137._8_4_ * fVar135;
      fStack_374 = auVar137._12_4_ * fVar134;
      uStack_370 = 0;
      uStack_36c = 0;
      uStack_368 = 0;
      uStack_364 = auVar16._28_4_;
      auVar194._8_4_ = 0xff800000;
      auVar194._0_8_ = 0xff800000ff800000;
      auVar194._12_4_ = 0xff800000;
      auVar194._16_4_ = 0xff800000;
      auVar194._20_4_ = 0xff800000;
      auVar194._24_4_ = 0xff800000;
      auVar194._28_4_ = 0xff800000;
      auVar191 = vblendvps_avx(auVar194,auVar34,auVar168);
      auVar169 = auVar168 & auVar14;
      if ((((((((auVar169 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar169 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar169 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar169 >> 0x7f,0) != '\0') ||
            (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar169 >> 0xbf,0) != '\0') ||
          (auVar169 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar169[0x1f] < '\0') {
        auVar93 = vandps_avx(auVar14,auVar168);
        auVar14 = vcmpps_avx(auVar256,ZEXT832(0) << 0x20,2);
        auVar233._8_4_ = 0xff800000;
        auVar233._0_8_ = 0xff800000ff800000;
        auVar233._12_4_ = 0xff800000;
        auVar233._16_4_ = 0xff800000;
        auVar233._20_4_ = 0xff800000;
        auVar233._24_4_ = 0xff800000;
        auVar233._28_4_ = 0xff800000;
        auVar258._8_4_ = 0x7f800000;
        auVar258._0_8_ = 0x7f8000007f800000;
        auVar258._12_4_ = 0x7f800000;
        auVar258._16_4_ = 0x7f800000;
        auVar258._20_4_ = 0x7f800000;
        auVar258._24_4_ = 0x7f800000;
        auVar258._28_4_ = 0x7f800000;
        auVar256 = vblendvps_avx(auVar258,auVar233,auVar14);
        auVar137 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
        auVar169 = vpmovsxwd_avx2(auVar137);
        auVar264 = vblendvps_avx(auVar264,auVar256,auVar169);
        auVar7 = vblendvps_avx(auVar233,auVar258,auVar14);
        auVar191 = vblendvps_avx(auVar191,auVar7,auVar169);
        auVar103._0_8_ = auVar93._0_8_ ^ 0xffffffffffffffff;
        auVar103._8_4_ = auVar93._8_4_ ^ 0xffffffff;
        auVar103._12_4_ = auVar93._12_4_ ^ 0xffffffff;
        auVar103._16_4_ = auVar93._16_4_ ^ 0xffffffff;
        auVar103._20_4_ = auVar93._20_4_ ^ 0xffffffff;
        auVar103._24_4_ = auVar93._24_4_ ^ 0xffffffff;
        auVar103._28_4_ = auVar93._28_4_ ^ 0xffffffff;
        auVar93 = vorps_avx(auVar14,auVar103);
        auVar93 = vandps_avx(auVar168,auVar93);
      }
    }
    local_3a0 = ZEXT1632(auVar88);
    auVar242 = ZEXT3264(auVar7);
    auVar256 = local_660 & auVar93;
    if ((((((((auVar256 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar256 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar256 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar256 >> 0x7f,0) != '\0') ||
          (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar256 >> 0xbf,0) != '\0') ||
        (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar256[0x1f] < '\0') {
      fVar218 = (ray->org).field_0.m128[3] - (float)local_850._0_4_;
      auVar97._4_4_ = fVar218;
      auVar97._0_4_ = fVar218;
      auVar97._8_4_ = fVar218;
      auVar97._12_4_ = fVar218;
      auVar97._16_4_ = fVar218;
      auVar97._20_4_ = fVar218;
      auVar97._24_4_ = fVar218;
      auVar97._28_4_ = fVar218;
      auVar14 = vmaxps_avx(auVar97,auVar264);
      fVar218 = ray->tfar - (float)local_850._0_4_;
      auVar208._4_4_ = fVar218;
      auVar208._0_4_ = fVar218;
      auVar208._8_4_ = fVar218;
      auVar208._12_4_ = fVar218;
      auVar208._16_4_ = fVar218;
      auVar208._20_4_ = fVar218;
      auVar208._24_4_ = fVar218;
      auVar208._28_4_ = fVar218;
      auVar169 = vminps_avx(auVar208,auVar191);
      auVar238._0_4_ = (float)local_aa0._0_4_ * fVar245;
      auVar238._4_4_ = local_aa0._4_4_ * fVar250;
      auVar238._8_4_ = local_aa0._8_4_ * fVar175;
      auVar238._12_4_ = local_aa0._12_4_ * fVar176;
      auVar238._16_4_ = local_aa0._16_4_ * fVar251;
      auVar238._20_4_ = local_aa0._20_4_ * fVar252;
      auVar238._28_36_ = SUB4836((undefined1  [48])0x0,0xc);
      auVar238._24_4_ = local_aa0._24_4_ * fVar253;
      auVar137 = vfmadd213ps_fma(auVar12,local_9a0,auVar238._0_32_);
      auVar88 = vfmadd213ps_fma(auVar144,local_700,ZEXT1632(auVar137));
      auVar167._0_4_ = local_540 * (float)local_aa0._0_4_;
      auVar167._4_4_ = fStack_53c * local_aa0._4_4_;
      auVar167._8_4_ = fStack_538 * local_aa0._8_4_;
      auVar167._12_4_ = fStack_534 * local_aa0._12_4_;
      auVar167._16_4_ = fStack_530 * local_aa0._16_4_;
      auVar167._20_4_ = fStack_52c * local_aa0._20_4_;
      auVar167._24_4_ = fStack_528 * local_aa0._24_4_;
      auVar167._28_4_ = 0;
      auVar137 = vfmadd231ps_fma(auVar167,_local_7a0,local_9a0);
      auVar238 = ZEXT3264(_local_520);
      auVar240 = vfmadd231ps_fma(ZEXT1632(auVar137),_local_520,local_700);
      auVar55._4_4_ = uStack_7bc;
      auVar55._0_4_ = local_7c0;
      auVar55._8_4_ = uStack_7b8;
      auVar55._12_4_ = uStack_7b4;
      auVar55._16_4_ = uStack_7b0;
      auVar55._20_4_ = uStack_7ac;
      auVar55._24_4_ = uStack_7a8;
      auVar55._28_4_ = uStack_7a4;
      auVar256 = vandps_avx(auVar55,ZEXT1632(auVar240));
      auVar209._8_4_ = 0x219392ef;
      auVar209._0_8_ = 0x219392ef219392ef;
      auVar209._12_4_ = 0x219392ef;
      auVar209._16_4_ = 0x219392ef;
      auVar209._20_4_ = 0x219392ef;
      auVar209._24_4_ = 0x219392ef;
      auVar209._28_4_ = 0x219392ef;
      auVar12 = vcmpps_avx(auVar256,auVar209,1);
      auVar256 = vrcpps_avx(ZEXT1632(auVar240));
      auVar227._8_4_ = 0x3f800000;
      auVar227._0_8_ = 0x3f8000003f800000;
      auVar227._12_4_ = 0x3f800000;
      auVar227._16_4_ = 0x3f800000;
      auVar227._20_4_ = 0x3f800000;
      auVar227._24_4_ = 0x3f800000;
      auVar227._28_4_ = 0x3f800000;
      auVar168 = ZEXT1632(auVar240);
      auVar137 = vfnmadd213ps_fma(auVar256,auVar168,auVar227);
      auVar137 = vfmadd132ps_fma(ZEXT1632(auVar137),auVar256,auVar256);
      auVar247._0_4_ = local_6a0 ^ auVar240._0_4_;
      auVar247._4_4_ = uStack_69c ^ auVar240._4_4_;
      auVar247._8_4_ = uStack_698 ^ auVar240._8_4_;
      auVar247._12_4_ = uStack_694 ^ auVar240._12_4_;
      auVar247._16_4_ = fStack_690;
      auVar247._20_4_ = fStack_68c;
      auVar247._24_4_ = fStack_688;
      auVar247._28_4_ = uStack_684;
      auVar36._4_4_ = auVar137._4_4_ * (float)(auVar88._4_4_ ^ uStack_69c);
      auVar36._0_4_ = auVar137._0_4_ * (float)(auVar88._0_4_ ^ local_6a0);
      auVar36._8_4_ = auVar137._8_4_ * (float)(auVar88._8_4_ ^ uStack_698);
      auVar36._12_4_ = auVar137._12_4_ * (float)(auVar88._12_4_ ^ uStack_694);
      auVar36._16_4_ = fStack_690 * 0.0;
      auVar36._20_4_ = fStack_68c * 0.0;
      auVar36._24_4_ = fStack_688 * 0.0;
      auVar36._28_4_ = uStack_684;
      auVar256 = vcmpps_avx(auVar168,auVar247,1);
      auVar256 = vorps_avx(auVar12,auVar256);
      auVar266._8_4_ = 0xff800000;
      auVar266._0_8_ = 0xff800000ff800000;
      auVar266._12_4_ = 0xff800000;
      auVar266._16_4_ = 0xff800000;
      auVar266._20_4_ = 0xff800000;
      auVar266._24_4_ = 0xff800000;
      auVar266._28_4_ = 0xff800000;
      auVar256 = vblendvps_avx(auVar36,auVar266,auVar256);
      auVar144 = vmaxps_avx(auVar14,auVar256);
      auVar256 = vcmpps_avx(auVar168,auVar247,6);
      auVar256 = vorps_avx(auVar12,auVar256);
      auVar248._8_4_ = 0x7f800000;
      auVar248._0_8_ = 0x7f8000007f800000;
      auVar248._12_4_ = 0x7f800000;
      auVar248._16_4_ = 0x7f800000;
      auVar248._20_4_ = 0x7f800000;
      auVar248._24_4_ = 0x7f800000;
      auVar248._28_4_ = 0x7f800000;
      auVar249 = ZEXT3264(auVar248);
      auVar256 = vblendvps_avx(auVar36,auVar248,auVar256);
      auVar14 = vminps_avx(auVar169,auVar256);
      fVar218 = (float)(local_6a0 ^ (uint)local_8e0._0_4_);
      fVar219 = (float)(uStack_69c ^ (uint)local_8e0._4_4_);
      fVar175 = (float)(uStack_698 ^ (uint)local_8e0._8_4_);
      fVar176 = (float)(uStack_694 ^ (uint)local_8e0._12_4_);
      fVar177 = (float)((uint)fStack_690 ^ (uint)local_8e0._16_4_);
      fVar178 = (float)((uint)fStack_68c ^ (uint)local_8e0._20_4_);
      fVar179 = (float)((uint)fStack_688 ^ (uint)local_8e0._24_4_);
      auVar195._0_4_ = local_6a0 ^ (uint)local_720._0_4_;
      auVar195._4_4_ = uStack_69c ^ (uint)local_720._4_4_;
      auVar195._8_4_ = uStack_698 ^ (uint)local_720._8_4_;
      auVar195._12_4_ = uStack_694 ^ (uint)local_720._12_4_;
      auVar195._16_4_ = (uint)fStack_690 ^ (uint)local_720._16_4_;
      auVar195._20_4_ = (uint)fStack_68c ^ (uint)local_720._20_4_;
      auVar195._24_4_ = (uint)fStack_688 ^ (uint)local_720._24_4_;
      auVar195._28_4_ = uStack_684 ^ local_720._28_4_;
      auVar256 = vsubps_avx(ZEXT832(0) << 0x20,auVar18);
      auVar12 = vsubps_avx(ZEXT832(0) << 0x20,local_980);
      auVar37._4_4_ = auVar12._4_4_ * fVar219;
      auVar37._0_4_ = auVar12._0_4_ * fVar218;
      auVar37._8_4_ = auVar12._8_4_ * fVar175;
      auVar37._12_4_ = auVar12._12_4_ * fVar176;
      auVar37._16_4_ = auVar12._16_4_ * fVar177;
      auVar37._20_4_ = auVar12._20_4_ * fVar178;
      auVar37._24_4_ = auVar12._24_4_ * fVar179;
      auVar37._28_4_ = auVar12._28_4_;
      auVar137 = vfmadd231ps_fma(auVar37,auVar195,auVar256);
      auVar210._0_4_ = local_6a0 ^ (uint)local_ac0._0_4_;
      auVar210._4_4_ = uStack_69c ^ (uint)local_ac0._4_4_;
      auVar210._8_4_ = uStack_698 ^ (uint)local_ac0._8_4_;
      auVar210._12_4_ = uStack_694 ^ (uint)local_ac0._12_4_;
      auVar210._16_4_ = (uint)fStack_690 ^ (uint)local_ac0._16_4_;
      auVar210._20_4_ = (uint)fStack_68c ^ (uint)local_ac0._20_4_;
      auVar210._24_4_ = (uint)fStack_688 ^ (uint)local_ac0._24_4_;
      auVar210._28_4_ = uStack_684 ^ local_ac0._28_4_;
      auVar256 = vsubps_avx(ZEXT832(0) << 0x20,auVar17);
      auVar88 = vfmadd231ps_fma(ZEXT1632(auVar137),auVar210,auVar256);
      auVar38._4_4_ = fStack_53c * fVar219;
      auVar38._0_4_ = local_540 * fVar218;
      auVar38._8_4_ = fStack_538 * fVar175;
      auVar38._12_4_ = fStack_534 * fVar176;
      auVar38._16_4_ = fStack_530 * fVar177;
      auVar38._20_4_ = fStack_52c * fVar178;
      auVar38._24_4_ = fStack_528 * fVar179;
      auVar38._28_4_ = uStack_684 ^ local_8e0._28_4_;
      auVar137 = vfmadd231ps_fma(auVar38,auVar195,_local_7a0);
      auVar240 = vfmadd231ps_fma(ZEXT1632(auVar137),_local_520,auVar210);
      auVar256 = vandps_avx(auVar55,ZEXT1632(auVar240));
      auVar17 = vrcpps_avx(ZEXT1632(auVar240));
      auVar241._8_4_ = 0x219392ef;
      auVar241._0_8_ = 0x219392ef219392ef;
      auVar241._12_4_ = 0x219392ef;
      auVar241._16_4_ = 0x219392ef;
      auVar241._20_4_ = 0x219392ef;
      auVar241._24_4_ = 0x219392ef;
      auVar241._28_4_ = 0x219392ef;
      auVar12 = vcmpps_avx(auVar256,auVar241,1);
      auVar169 = ZEXT1632(auVar240);
      auVar137 = vfnmadd213ps_fma(auVar17,auVar169,auVar227);
      auVar137 = vfmadd132ps_fma(ZEXT1632(auVar137),auVar17,auVar17);
      auVar211._0_4_ = local_6a0 ^ auVar240._0_4_;
      auVar211._4_4_ = uStack_69c ^ auVar240._4_4_;
      auVar211._8_4_ = uStack_698 ^ auVar240._8_4_;
      auVar211._12_4_ = uStack_694 ^ auVar240._12_4_;
      auVar211._16_4_ = fStack_690;
      auVar211._20_4_ = fStack_68c;
      auVar211._24_4_ = fStack_688;
      auVar211._28_4_ = uStack_684;
      auVar39._4_4_ = auVar137._4_4_ * (float)(uStack_69c ^ auVar88._4_4_);
      auVar39._0_4_ = auVar137._0_4_ * (float)(local_6a0 ^ auVar88._0_4_);
      auVar39._8_4_ = auVar137._8_4_ * (float)(uStack_698 ^ auVar88._8_4_);
      auVar39._12_4_ = auVar137._12_4_ * (float)(uStack_694 ^ auVar88._12_4_);
      auVar39._16_4_ = fStack_690 * 0.0;
      auVar39._20_4_ = fStack_68c * 0.0;
      auVar39._24_4_ = fStack_688 * 0.0;
      auVar39._28_4_ = uStack_684;
      auVar256 = vcmpps_avx(auVar169,auVar211,1);
      auVar256 = vorps_avx(auVar256,auVar12);
      auVar256 = vblendvps_avx(auVar39,auVar266,auVar256);
      auVar242 = ZEXT3264(auVar256);
      _local_680 = vmaxps_avx(auVar144,auVar256);
      auVar256 = vcmpps_avx(auVar169,auVar211,6);
      auVar256 = vorps_avx(auVar12,auVar256);
      auVar256 = vblendvps_avx(auVar39,auVar248,auVar256);
      auVar93 = vandps_avx(local_660,auVar93);
      local_4a0 = vminps_avx(auVar14,auVar256);
      auVar256 = vcmpps_avx(_local_680,local_4a0,2);
      auVar12 = auVar93 & auVar256;
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0x7f,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0xbf,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar12[0x1f] < '\0') {
        auVar212._8_4_ = 0x3f800000;
        auVar212._0_8_ = 0x3f8000003f800000;
        auVar212._12_4_ = 0x3f800000;
        auVar212._16_4_ = 0x3f800000;
        auVar212._20_4_ = 0x3f800000;
        auVar212._24_4_ = 0x3f800000;
        auVar212._28_4_ = 0x3f800000;
        auVar12 = vminps_avx(local_360,auVar212);
        auVar12 = vmaxps_avx(auVar12,ZEXT832(0) << 0x20);
        auVar61._4_4_ = fStack_37c;
        auVar61._0_4_ = local_380;
        auVar61._8_4_ = fStack_378;
        auVar61._12_4_ = fStack_374;
        auVar61._16_4_ = uStack_370;
        auVar61._20_4_ = uStack_36c;
        auVar61._24_4_ = uStack_368;
        auVar61._28_4_ = uStack_364;
        auVar144 = vminps_avx(auVar61,auVar212);
        auVar144 = vmaxps_avx(auVar144,ZEXT832(0) << 0x20);
        auVar40._4_4_ = (auVar12._4_4_ + 1.0) * 0.125;
        auVar40._0_4_ = (auVar12._0_4_ + 0.0) * 0.125;
        auVar40._8_4_ = (auVar12._8_4_ + 2.0) * 0.125;
        auVar40._12_4_ = (auVar12._12_4_ + 3.0) * 0.125;
        auVar40._16_4_ = (auVar12._16_4_ + 4.0) * 0.125;
        auVar40._20_4_ = (auVar12._20_4_ + 5.0) * 0.125;
        auVar40._24_4_ = (auVar12._24_4_ + 6.0) * 0.125;
        auVar40._28_4_ = auVar12._28_4_ + 7.0;
        auVar137 = vfmadd213ps_fma(auVar40,local_760,local_740);
        auVar41._4_4_ = (auVar144._4_4_ + 1.0) * 0.125;
        auVar41._0_4_ = (auVar144._0_4_ + 0.0) * 0.125;
        auVar41._8_4_ = (auVar144._8_4_ + 2.0) * 0.125;
        auVar41._12_4_ = (auVar144._12_4_ + 3.0) * 0.125;
        auVar41._16_4_ = (auVar144._16_4_ + 4.0) * 0.125;
        auVar41._20_4_ = (auVar144._20_4_ + 5.0) * 0.125;
        auVar41._24_4_ = (auVar144._24_4_ + 6.0) * 0.125;
        auVar41._28_4_ = auVar144._28_4_ + 7.0;
        auVar88 = vfmadd213ps_fma(auVar41,local_760,local_740);
        auVar12 = vminps_avx(auVar231,auVar166);
        auVar144 = vminps_avx(auVar19,auVar20);
        auVar12 = vminps_avx(auVar12,auVar144);
        auVar143 = vsubps_avx(auVar12,auVar143);
        local_960._0_32_ = vandps_avx(auVar256,auVar93);
        local_1a0 = ZEXT1632(auVar137);
        local_1c0 = ZEXT1632(auVar88);
        auVar42._4_4_ = auVar143._4_4_ * 0.99999976;
        auVar42._0_4_ = auVar143._0_4_ * 0.99999976;
        auVar42._8_4_ = auVar143._8_4_ * 0.99999976;
        auVar42._12_4_ = auVar143._12_4_ * 0.99999976;
        auVar42._16_4_ = auVar143._16_4_ * 0.99999976;
        auVar42._20_4_ = auVar143._20_4_ * 0.99999976;
        auVar42._24_4_ = auVar143._24_4_ * 0.99999976;
        auVar42._28_4_ = 0x3f7ffffc;
        auVar93 = vmaxps_avx(ZEXT832(0) << 0x20,auVar42);
        auVar43._4_4_ = auVar93._4_4_ * auVar93._4_4_;
        auVar43._0_4_ = auVar93._0_4_ * auVar93._0_4_;
        auVar43._8_4_ = auVar93._8_4_ * auVar93._8_4_;
        auVar43._12_4_ = auVar93._12_4_ * auVar93._12_4_;
        auVar43._16_4_ = auVar93._16_4_ * auVar93._16_4_;
        auVar43._20_4_ = auVar93._20_4_ * auVar93._20_4_;
        auVar43._24_4_ = auVar93._24_4_ * auVar93._24_4_;
        auVar43._28_4_ = auVar93._28_4_;
        auVar256 = vsubps_avx(auVar15,auVar43);
        auVar242 = ZEXT3264(auVar256);
        auVar44._4_4_ = auVar256._4_4_ * fVar133 * 4.0;
        auVar44._0_4_ = auVar256._0_4_ * fVar132 * 4.0;
        auVar44._8_4_ = auVar256._8_4_ * fVar197 * 4.0;
        auVar44._12_4_ = auVar256._12_4_ * fVar214 * 4.0;
        auVar44._16_4_ = auVar256._16_4_ * fVar215 * 4.0;
        auVar44._20_4_ = auVar256._20_4_ * fVar216 * 4.0;
        auVar44._24_4_ = auVar256._24_4_ * fVar217 * 4.0;
        auVar44._28_4_ = auVar93._28_4_;
        auVar12 = vsubps_avx(auVar31,auVar44);
        auVar54 = ZEXT412(0);
        auVar144 = ZEXT1232(auVar54) << 0x20;
        local_800 = ZEXT1232(auVar54) << 0x20;
        _local_8c0 = vcmpps_avx(auVar12,ZEXT832(0) << 0x20,5);
        auVar93 = _local_8c0;
        if ((((((((_local_8c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (_local_8c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (_local_8c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(_local_8c0 >> 0x7f,0) == '\0') &&
              (_local_8c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(_local_8c0 >> 0xbf,0) == '\0') &&
            (_local_8c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_8c0[0x1f]) {
          _local_820 = ZEXT1232(auVar54) << 0x20;
          auVar170 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar188 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar213._8_4_ = 0x7f800000;
          auVar213._0_8_ = 0x7f8000007f800000;
          auVar213._12_4_ = 0x7f800000;
          auVar213._16_4_ = 0x7f800000;
          auVar213._20_4_ = 0x7f800000;
          auVar213._24_4_ = 0x7f800000;
          auVar213._28_4_ = 0x7f800000;
          auVar222._8_4_ = 0xff800000;
          auVar222._0_8_ = 0xff800000ff800000;
          auVar222._12_4_ = 0xff800000;
          auVar222._16_4_ = 0xff800000;
          auVar222._20_4_ = 0xff800000;
          auVar222._24_4_ = 0xff800000;
          auVar222._28_4_ = 0xff800000;
          _local_8c0 = auVar18;
          _local_7e0 = local_800;
        }
        else {
          auVar14 = vsqrtps_avx(auVar12);
          auVar171._0_4_ = fVar132 + fVar132;
          auVar171._4_4_ = fVar133 + fVar133;
          auVar171._8_4_ = fVar197 + fVar197;
          auVar171._12_4_ = fVar214 + fVar214;
          auVar171._16_4_ = fVar215 + fVar215;
          auVar171._20_4_ = fVar216 + fVar216;
          auVar171._24_4_ = fVar217 + fVar217;
          auVar171._28_4_ = fVar106 + fVar106;
          auVar144 = vrcpps_avx(auVar171);
          auVar122._8_4_ = 0x3f800000;
          auVar122._0_8_ = 0x3f8000003f800000;
          auVar122._12_4_ = 0x3f800000;
          auVar122._16_4_ = 0x3f800000;
          auVar122._20_4_ = 0x3f800000;
          auVar122._24_4_ = 0x3f800000;
          auVar122._28_4_ = 0x3f800000;
          auVar137 = vfnmadd213ps_fma(auVar171,auVar144,auVar122);
          auVar137 = vfmadd132ps_fma(ZEXT1632(auVar137),auVar144,auVar144);
          auVar196._0_4_ = (uint)auVar237._0_4_ ^ local_6a0;
          auVar196._4_4_ = (uint)auVar237._4_4_ ^ uStack_69c;
          auVar196._8_4_ = (uint)auVar237._8_4_ ^ uStack_698;
          auVar196._12_4_ = (uint)auVar237._12_4_ ^ uStack_694;
          auVar196._16_4_ = (uint)auVar237._16_4_ ^ (uint)fStack_690;
          auVar196._20_4_ = (uint)auVar237._20_4_ ^ (uint)fStack_68c;
          auVar196._24_4_ = (uint)auVar237._24_4_ ^ (uint)fStack_688;
          auVar196._28_4_ = (uint)auVar237._28_4_ ^ uStack_684;
          auVar144 = vsubps_avx(auVar196,auVar14);
          auVar14 = vsubps_avx(auVar14,auVar237);
          fVar106 = auVar144._0_4_ * auVar137._0_4_;
          fVar132 = auVar144._4_4_ * auVar137._4_4_;
          auVar45._4_4_ = fVar132;
          auVar45._0_4_ = fVar106;
          fVar133 = auVar144._8_4_ * auVar137._8_4_;
          auVar45._8_4_ = fVar133;
          fVar197 = auVar144._12_4_ * auVar137._12_4_;
          auVar45._12_4_ = fVar197;
          fVar214 = auVar144._16_4_ * 0.0;
          auVar45._16_4_ = fVar214;
          fVar215 = auVar144._20_4_ * 0.0;
          auVar45._20_4_ = fVar215;
          fVar216 = auVar144._24_4_ * 0.0;
          auVar45._24_4_ = fVar216;
          auVar45._28_4_ = auVar143._28_4_;
          fVar217 = auVar14._0_4_ * auVar137._0_4_;
          fVar218 = auVar14._4_4_ * auVar137._4_4_;
          auVar46._4_4_ = fVar218;
          auVar46._0_4_ = fVar217;
          fVar219 = auVar14._8_4_ * auVar137._8_4_;
          auVar46._8_4_ = fVar219;
          fVar175 = auVar14._12_4_ * auVar137._12_4_;
          auVar46._12_4_ = fVar175;
          fVar176 = auVar14._16_4_ * 0.0;
          auVar46._16_4_ = fVar176;
          fVar177 = auVar14._20_4_ * 0.0;
          auVar46._20_4_ = fVar177;
          fVar178 = auVar14._24_4_ * 0.0;
          auVar46._24_4_ = fVar178;
          auVar46._28_4_ = fStack_524;
          auVar137 = vfmadd213ps_fma(local_3a0,auVar45,local_9c0);
          auVar88 = vfmadd213ps_fma(local_3a0,auVar46,local_9c0);
          auVar47._28_4_ = auVar144._28_4_;
          auVar47._0_28_ =
               ZEXT1628(CONCAT412(fVar134 * auVar137._12_4_,
                                  CONCAT48(fVar135 * auVar137._8_4_,
                                           CONCAT44(fVar131 * auVar137._4_4_,
                                                    fVar130 * auVar137._0_4_))));
          auVar143 = ZEXT1632(CONCAT412(fVar134 * auVar88._12_4_,
                                        CONCAT48(fVar135 * auVar88._8_4_,
                                                 CONCAT44(fVar131 * auVar88._4_4_,
                                                          fVar130 * auVar88._0_4_))));
          auVar137 = vfmadd213ps_fma(auVar236,auVar47,local_ae0);
          auVar88 = vfmadd213ps_fma(auVar236,auVar143,local_ae0);
          auVar240 = vfmadd213ps_fma(auVar13,auVar47,auVar94);
          auVar204 = vfmadd213ps_fma(auVar13,auVar143,auVar94);
          auVar8 = vfmadd213ps_fma(auVar47,auVar170,auVar263);
          auVar9 = vfmadd213ps_fma(auVar170,auVar143,auVar263);
          auVar48._4_4_ = (float)local_520._4_4_ * fVar132;
          auVar48._0_4_ = (float)local_520._0_4_ * fVar106;
          auVar48._8_4_ = fStack_518 * fVar133;
          auVar48._12_4_ = fStack_514 * fVar197;
          auVar48._16_4_ = fStack_510 * fVar214;
          auVar48._20_4_ = fStack_50c * fVar215;
          auVar48._24_4_ = fStack_508 * fVar216;
          auVar48._28_4_ = 0;
          auVar144 = vsubps_avx(auVar48,ZEXT1632(auVar137));
          auVar172._0_4_ = (float)local_7a0._0_4_ * fVar106;
          auVar172._4_4_ = (float)local_7a0._4_4_ * fVar132;
          auVar172._8_4_ = fStack_798 * fVar133;
          auVar172._12_4_ = fStack_794 * fVar197;
          auVar172._16_4_ = fStack_790 * fVar214;
          auVar172._20_4_ = fStack_78c * fVar215;
          auVar172._24_4_ = fStack_788 * fVar216;
          auVar172._28_4_ = 0;
          auVar170 = vsubps_avx(auVar172,ZEXT1632(auVar240));
          auVar223._0_4_ = local_540 * fVar106;
          auVar223._4_4_ = fStack_53c * fVar132;
          auVar223._8_4_ = fStack_538 * fVar133;
          auVar223._12_4_ = fStack_534 * fVar197;
          auVar223._16_4_ = fStack_530 * fVar214;
          auVar223._20_4_ = fStack_52c * fVar215;
          auVar223._24_4_ = fStack_528 * fVar216;
          auVar223._28_4_ = 0;
          auVar143 = vsubps_avx(auVar223,ZEXT1632(auVar8));
          auVar188 = auVar143._0_28_;
          auVar49._4_4_ = (float)local_520._4_4_ * fVar218;
          auVar49._0_4_ = (float)local_520._0_4_ * fVar217;
          auVar49._8_4_ = fStack_518 * fVar219;
          auVar49._12_4_ = fStack_514 * fVar175;
          auVar49._16_4_ = fStack_510 * fVar176;
          auVar49._20_4_ = fStack_50c * fVar177;
          auVar49._24_4_ = fStack_508 * fVar178;
          auVar49._28_4_ = 0;
          _local_7e0 = vsubps_avx(auVar49,ZEXT1632(auVar88));
          auVar50._4_4_ = fVar218 * (float)local_7a0._4_4_;
          auVar50._0_4_ = fVar217 * (float)local_7a0._0_4_;
          auVar50._8_4_ = fVar219 * fStack_798;
          auVar50._12_4_ = fVar175 * fStack_794;
          auVar50._16_4_ = fVar176 * fStack_790;
          auVar50._20_4_ = fVar177 * fStack_78c;
          auVar50._24_4_ = fVar178 * fStack_788;
          auVar50._28_4_ = local_7e0._28_4_;
          local_800 = vsubps_avx(auVar50,ZEXT1632(auVar204));
          auVar51._4_4_ = fStack_53c * fVar218;
          auVar51._0_4_ = local_540 * fVar217;
          auVar51._8_4_ = fStack_538 * fVar219;
          auVar51._12_4_ = fStack_534 * fVar175;
          auVar51._16_4_ = fStack_530 * fVar176;
          auVar51._20_4_ = fStack_52c * fVar177;
          auVar51._24_4_ = fStack_528 * fVar178;
          auVar51._28_4_ = local_800._28_4_;
          _local_820 = vsubps_avx(auVar51,ZEXT1632(auVar9));
          auVar12 = vcmpps_avx(auVar12,_DAT_01faff00,5);
          auVar224._8_4_ = 0x7f800000;
          auVar224._0_8_ = 0x7f8000007f800000;
          auVar224._12_4_ = 0x7f800000;
          auVar224._16_4_ = 0x7f800000;
          auVar224._20_4_ = 0x7f800000;
          auVar224._24_4_ = 0x7f800000;
          auVar224._28_4_ = 0x7f800000;
          auVar213 = vblendvps_avx(auVar224,auVar45,auVar12);
          auVar56._4_4_ = uStack_7bc;
          auVar56._0_4_ = local_7c0;
          auVar56._8_4_ = uStack_7b8;
          auVar56._12_4_ = uStack_7b4;
          auVar56._16_4_ = uStack_7b0;
          auVar56._20_4_ = uStack_7ac;
          auVar56._24_4_ = uStack_7a8;
          auVar56._28_4_ = uStack_7a4;
          auVar143 = vandps_avx(auVar56,local_8a0);
          auVar143 = vmaxps_avx(local_440,auVar143);
          auVar52._4_4_ = auVar143._4_4_ * 1.9073486e-06;
          auVar52._0_4_ = auVar143._0_4_ * 1.9073486e-06;
          auVar52._8_4_ = auVar143._8_4_ * 1.9073486e-06;
          auVar52._12_4_ = auVar143._12_4_ * 1.9073486e-06;
          auVar52._16_4_ = auVar143._16_4_ * 1.9073486e-06;
          auVar52._20_4_ = auVar143._20_4_ * 1.9073486e-06;
          auVar52._24_4_ = auVar143._24_4_ * 1.9073486e-06;
          auVar52._28_4_ = auVar143._28_4_;
          auVar143 = vandps_avx(_local_620,auVar56);
          auVar143 = vcmpps_avx(auVar143,auVar52,1);
          auVar225._8_4_ = 0xff800000;
          auVar225._0_8_ = 0xff800000ff800000;
          auVar225._12_4_ = 0xff800000;
          auVar225._16_4_ = 0xff800000;
          auVar225._20_4_ = 0xff800000;
          auVar225._24_4_ = 0xff800000;
          auVar225._28_4_ = 0xff800000;
          auVar222 = vblendvps_avx(auVar225,auVar46,auVar12);
          auVar14 = auVar12 & auVar143;
          if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0x7f,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar14 >> 0xbf,0) != '\0') ||
              (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar14[0x1f] < '\0') {
            auVar93 = vandps_avx(auVar143,auVar12);
            auVar143 = vcmpps_avx(auVar256,ZEXT832(0) << 0x20,2);
            auVar242 = ZEXT3264(auVar143);
            auVar127._8_4_ = 0xff800000;
            auVar127._0_8_ = 0xff800000ff800000;
            auVar127._12_4_ = 0xff800000;
            auVar127._16_4_ = 0xff800000;
            auVar127._20_4_ = 0xff800000;
            auVar127._24_4_ = 0xff800000;
            auVar127._28_4_ = 0xff800000;
            auVar259._8_4_ = 0x7f800000;
            auVar259._0_8_ = 0x7f8000007f800000;
            auVar259._12_4_ = 0x7f800000;
            auVar259._16_4_ = 0x7f800000;
            auVar259._20_4_ = 0x7f800000;
            auVar259._24_4_ = 0x7f800000;
            auVar259._28_4_ = 0x7f800000;
            auVar256 = vblendvps_avx(auVar259,auVar127,auVar143);
            auVar137 = vpackssdw_avx(auVar93._0_16_,auVar93._16_16_);
            auVar14 = vpmovsxwd_avx2(auVar137);
            auVar213 = vblendvps_avx(auVar213,auVar256,auVar14);
            auVar256 = vblendvps_avx(auVar127,auVar259,auVar143);
            auVar222 = vblendvps_avx(auVar222,auVar256,auVar14);
            auVar234._0_8_ = auVar93._0_8_ ^ 0xffffffffffffffff;
            auVar234._8_4_ = auVar93._8_4_ ^ 0xffffffff;
            auVar234._12_4_ = auVar93._12_4_ ^ 0xffffffff;
            auVar234._16_4_ = auVar93._16_4_ ^ 0xffffffff;
            auVar234._20_4_ = auVar93._20_4_ ^ 0xffffffff;
            auVar234._24_4_ = auVar93._24_4_ ^ 0xffffffff;
            auVar234._28_4_ = auVar93._28_4_ ^ 0xffffffff;
            auVar93 = vorps_avx(auVar143,auVar234);
            auVar93 = vandps_avx(auVar93,auVar12);
          }
        }
        uVar77 = *(undefined4 *)&(ray->dir).field_0;
        local_5e0._4_4_ = uVar77;
        local_5e0._0_4_ = uVar77;
        local_5e0._8_4_ = uVar77;
        local_5e0._12_4_ = uVar77;
        local_5e0._16_4_ = uVar77;
        local_5e0._20_4_ = uVar77;
        local_5e0._24_4_ = uVar77;
        local_5e0._28_4_ = uVar77;
        auVar238 = ZEXT3264(local_5e0);
        uVar77 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
        local_600._4_4_ = uVar77;
        local_600._0_4_ = uVar77;
        local_600._8_4_ = uVar77;
        local_600._12_4_ = uVar77;
        local_600._16_4_ = uVar77;
        local_600._20_4_ = uVar77;
        local_600._24_4_ = uVar77;
        local_600._28_4_ = uVar77;
        auVar249 = ZEXT3264(local_600);
        fVar106 = (ray->dir).field_0.m128[2];
        local_480 = _local_680;
        local_460 = vminps_avx(local_4a0,auVar213);
        local_6c0 = vmaxps_avx(_local_680,auVar222);
        local_4c0 = local_6c0;
        auVar256 = vcmpps_avx(_local_680,local_460,2);
        local_560 = vandps_avx(auVar256,local_960._0_32_);
        auVar256 = vcmpps_avx(local_6c0,local_4a0,2);
        local_5a0 = vandps_avx(auVar256,local_960._0_32_);
        auVar256 = vorps_avx(local_5a0,local_560);
        if ((((((((auVar256 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar256 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar256 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar256 >> 0x7f,0) != '\0') ||
              (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar256 >> 0xbf,0) != '\0') ||
            (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar256[0x1f] < '\0') {
          local_640._0_8_ = auVar93._0_8_ ^ 0xffffffffffffffff;
          local_640._8_4_ = auVar93._8_4_ ^ 0xffffffff;
          local_640._12_4_ = auVar93._12_4_ ^ 0xffffffff;
          local_640._16_4_ = auVar93._16_4_ ^ 0xffffffff;
          local_640._20_4_ = auVar93._20_4_ ^ 0xffffffff;
          local_640._24_4_ = auVar93._24_4_ ^ 0xffffffff;
          local_640._28_4_ = auVar93._28_4_ ^ 0xffffffff;
          auVar53._4_4_ = fVar106 * auVar188._4_4_;
          auVar53._0_4_ = fVar106 * auVar188._0_4_;
          auVar53._8_4_ = fVar106 * auVar188._8_4_;
          auVar53._12_4_ = fVar106 * auVar188._12_4_;
          auVar53._16_4_ = fVar106 * auVar188._16_4_;
          auVar53._20_4_ = fVar106 * auVar188._20_4_;
          auVar53._24_4_ = fVar106 * auVar188._24_4_;
          auVar53._28_4_ = auVar256._28_4_;
          auVar137 = vfmadd213ps_fma(auVar170,local_600,auVar53);
          auVar137 = vfmadd213ps_fma(auVar144,local_5e0,ZEXT1632(auVar137));
          auVar57._4_4_ = uStack_7bc;
          auVar57._0_4_ = local_7c0;
          auVar57._8_4_ = uStack_7b8;
          auVar57._12_4_ = uStack_7b4;
          auVar57._16_4_ = uStack_7b0;
          auVar57._20_4_ = uStack_7ac;
          auVar57._24_4_ = uStack_7a8;
          auVar57._28_4_ = uStack_7a4;
          auVar93 = vandps_avx(ZEXT1632(auVar137),auVar57);
          auVar123._8_4_ = 0x3e99999a;
          auVar123._0_8_ = 0x3e99999a3e99999a;
          auVar123._12_4_ = 0x3e99999a;
          auVar123._16_4_ = 0x3e99999a;
          auVar123._20_4_ = 0x3e99999a;
          auVar123._24_4_ = 0x3e99999a;
          auVar123._28_4_ = 0x3e99999a;
          auVar93 = vcmpps_avx(auVar93,auVar123,1);
          auVar93 = vorps_avx(auVar93,local_640);
          auVar124._8_4_ = 3;
          auVar124._0_8_ = 0x300000003;
          auVar124._12_4_ = 3;
          auVar124._16_4_ = 3;
          auVar124._20_4_ = 3;
          auVar124._24_4_ = 3;
          auVar124._28_4_ = 3;
          auVar145._8_4_ = 2;
          auVar145._0_8_ = 0x200000002;
          auVar145._12_4_ = 2;
          auVar145._16_4_ = 2;
          auVar145._20_4_ = 2;
          auVar145._24_4_ = 2;
          auVar145._28_4_ = 2;
          auVar93 = vblendvps_avx(auVar145,auVar124,auVar93);
          local_5c0._4_4_ = local_b54;
          local_5c0._0_4_ = local_b54;
          local_5c0._8_4_ = local_b54;
          local_5c0._12_4_ = local_b54;
          local_5c0._16_4_ = local_b54;
          local_5c0._20_4_ = local_b54;
          local_5c0._24_4_ = local_b54;
          local_5c0._28_4_ = local_b54;
          local_580 = vpcmpgtd_avx2(auVar93,local_5c0);
          local_500 = vpandn_avx2(local_580,local_560);
          auVar128 = ZEXT3264(local_500);
          auVar93 = local_560 & ~local_580;
          if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar93 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar93 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar93 >> 0x7f,0) == '\0') &&
                (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar93 >> 0xbf,0) == '\0') &&
              (auVar93 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar93[0x1f]) {
            fVar130 = ray->tfar;
            auVar98._4_4_ = fVar130;
            auVar98._0_4_ = fVar130;
            auVar98._8_4_ = fVar130;
            auVar98._12_4_ = fVar130;
            auVar98._16_4_ = fVar130;
            auVar98._20_4_ = fVar130;
            auVar98._24_4_ = fVar130;
            auVar98._28_4_ = fVar130;
            auVar93 = local_640;
            fVar130 = fVar106;
            fVar131 = fVar106;
            fVar132 = fVar106;
            fVar135 = fVar106;
            fVar133 = fVar106;
            fVar134 = fVar106;
            local_640 = auVar237;
            local_600 = auVar13;
            local_5e0 = auVar236;
          }
          else {
            local_620._4_4_ = fVar106;
            local_620._0_4_ = fVar106;
            fStack_618 = fVar106;
            fStack_614 = fVar106;
            fStack_610 = fVar106;
            fStack_60c = fVar106;
            fStack_608 = fVar106;
            fStack_604 = fVar106;
            auVar88 = vminps_avx(local_a20,local_a40);
            auVar137 = vmaxps_avx(local_a20,local_a40);
            auVar240 = vminps_avx(local_a30,_local_a50);
            auVar204 = vminps_avx(auVar88,auVar240);
            auVar88 = vmaxps_avx(local_a30,_local_a50);
            auVar240 = vmaxps_avx(auVar137,auVar88);
            auVar137 = vandps_avx(auVar204,local_a60);
            auVar88 = vandps_avx(auVar240,local_a60);
            auVar137 = vmaxps_avx(auVar137,auVar88);
            auVar88 = vmovshdup_avx(auVar137);
            auVar88 = vmaxss_avx(auVar88,auVar137);
            auVar137 = vshufpd_avx(auVar137,auVar137,1);
            auVar137 = vmaxss_avx(auVar137,auVar88);
            local_960._0_4_ = auVar137._0_4_ * 1.9073486e-06;
            auVar137 = vshufps_avx(auVar240,auVar240,0xff);
            local_780 = ZEXT1632(auVar137);
            local_9e0._4_4_ = (float)local_680._4_4_ + (float)local_880._4_4_;
            local_9e0._0_4_ = (float)local_680._0_4_ + (float)local_880._0_4_;
            fStack_9d8 = fStack_678 + fStack_878;
            fStack_9d4 = fStack_674 + fStack_874;
            fStack_9d0 = fStack_670 + fStack_870;
            fStack_9cc = fStack_66c + fStack_86c;
            fStack_9c8 = fStack_668 + fStack_868;
            fStack_9c4 = fStack_664 + fStack_864;
            do {
              auVar99._8_4_ = 0x7f800000;
              auVar99._0_8_ = 0x7f8000007f800000;
              auVar99._12_4_ = 0x7f800000;
              auVar99._16_4_ = 0x7f800000;
              auVar99._20_4_ = 0x7f800000;
              auVar99._24_4_ = 0x7f800000;
              auVar99._28_4_ = 0x7f800000;
              auVar93 = auVar128._0_32_;
              auVar256 = vblendvps_avx(auVar99,_local_680,auVar93);
              auVar143 = vshufps_avx(auVar256,auVar256,0xb1);
              auVar143 = vminps_avx(auVar256,auVar143);
              auVar12 = vshufpd_avx(auVar143,auVar143,5);
              auVar143 = vminps_avx(auVar143,auVar12);
              auVar12 = vpermpd_avx2(auVar143,0x4e);
              auVar143 = vminps_avx(auVar143,auVar12);
              auVar256 = vcmpps_avx(auVar256,auVar143,0);
              auVar143 = auVar93 & auVar256;
              if ((((((((auVar143 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar143 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar143 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar143 >> 0x7f,0) != '\0') ||
                    (auVar143 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar143 >> 0xbf,0) != '\0') ||
                  (auVar143 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar143[0x1f] < '\0') {
                auVar93 = vandps_avx(auVar256,auVar93);
              }
              uVar68 = vmovmskps_avx(auVar93);
              iVar21 = 0;
              for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
                iVar21 = iVar21 + 1;
              }
              uVar69 = iVar21 << 2;
              *(undefined4 *)(local_500 + uVar69) = 0;
              aVar2 = (ray->dir).field_0;
              local_9c0._0_16_ = (undefined1  [16])aVar2;
              auVar137 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
              uVar68 = *(uint *)(local_1a0 + uVar69);
              if (auVar137._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416(*(uint *)(local_480 + uVar69));
                fVar106 = sqrtf(auVar137._0_4_);
                auVar137 = local_ae0._0_16_;
              }
              else {
                auVar137 = vsqrtss_avx(auVar137,auVar137);
                fVar106 = auVar137._0_4_;
                auVar137 = ZEXT416(*(uint *)(local_480 + uVar69));
              }
              local_720._0_4_ = fVar106 * 1.9073486e-06;
              auVar137 = vinsertps_avx(auVar137,ZEXT416(uVar68),0x10);
              bVar76 = true;
              uVar74 = 0;
              do {
                local_980._0_16_ = vmovshdup_avx(auVar137);
                fVar135 = 1.0 - local_980._0_4_;
                auVar88 = vshufps_avx(auVar137,auVar137,0x55);
                fVar106 = auVar88._0_4_;
                auVar110._0_4_ = local_a40._0_4_ * fVar106;
                fVar130 = auVar88._4_4_;
                auVar110._4_4_ = local_a40._4_4_ * fVar130;
                fVar131 = auVar88._8_4_;
                auVar110._8_4_ = local_a40._8_4_ * fVar131;
                fVar132 = auVar88._12_4_;
                auVar110._12_4_ = local_a40._12_4_ * fVar132;
                auVar138._4_4_ = fVar135;
                auVar138._0_4_ = fVar135;
                auVar138._8_4_ = fVar135;
                auVar138._12_4_ = fVar135;
                auVar88 = vfmadd231ps_fma(auVar110,auVar138,local_a20);
                auVar152._0_4_ = local_a30._0_4_ * fVar106;
                auVar152._4_4_ = local_a30._4_4_ * fVar130;
                auVar152._8_4_ = local_a30._8_4_ * fVar131;
                auVar152._12_4_ = local_a30._12_4_ * fVar132;
                auVar240 = vfmadd231ps_fma(auVar152,auVar138,local_a40);
                auVar203._0_4_ = fVar106 * auVar240._0_4_;
                auVar203._4_4_ = fVar130 * auVar240._4_4_;
                auVar203._8_4_ = fVar131 * auVar240._8_4_;
                auVar203._12_4_ = fVar132 * auVar240._12_4_;
                auVar204 = vfmadd231ps_fma(auVar203,auVar138,auVar88);
                auVar111._0_4_ = fVar106 * (float)local_a50._0_4_;
                auVar111._4_4_ = fVar130 * (float)local_a50._4_4_;
                auVar111._8_4_ = fVar131 * fStack_a48;
                auVar111._12_4_ = fVar132 * fStack_a44;
                auVar88 = vfmadd231ps_fma(auVar111,auVar138,local_a30);
                auVar182._0_4_ = fVar106 * auVar88._0_4_;
                auVar182._4_4_ = fVar130 * auVar88._4_4_;
                auVar182._8_4_ = fVar131 * auVar88._8_4_;
                auVar182._12_4_ = fVar132 * auVar88._12_4_;
                local_ac0._0_16_ = vfmadd231ps_fma(auVar182,auVar138,auVar240);
                fVar133 = auVar137._0_4_;
                auVar112._4_4_ = fVar133;
                auVar112._0_4_ = fVar133;
                auVar112._8_4_ = fVar133;
                auVar112._12_4_ = fVar133;
                auVar88 = vfmadd213ps_fma(auVar112,local_9c0._0_16_,_DAT_01f7aa10);
                auVar84._0_4_ = fVar106 * local_ac0._0_4_;
                auVar84._4_4_ = fVar130 * local_ac0._4_4_;
                auVar84._8_4_ = fVar131 * local_ac0._8_4_;
                auVar84._12_4_ = fVar132 * local_ac0._12_4_;
                auVar240 = vfmadd231ps_fma(auVar84,auVar204,auVar138);
                local_700._0_16_ = auVar240;
                auVar88 = vsubps_avx(auVar88,auVar240);
                _local_8c0 = auVar88;
                auVar88 = vdpps_avx(auVar88,auVar88,0x7f);
                local_ae0._0_16_ = auVar88;
                if (auVar88._0_4_ < 0.0) {
                  local_9a0._0_16_ = ZEXT416((uint)fVar135);
                  local_aa0._0_16_ = auVar204;
                  auVar104._0_4_ = sqrtf(auVar88._0_4_);
                  auVar104._4_60_ = extraout_var;
                  auVar88 = auVar104._0_16_;
                  auVar204 = local_aa0._0_16_;
                  auVar240 = local_9a0._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar88,auVar88);
                  auVar240 = ZEXT416((uint)fVar135);
                }
                auVar204 = vsubps_avx(local_ac0._0_16_,auVar204);
                auVar220._0_4_ = auVar204._0_4_ * 3.0;
                auVar220._4_4_ = auVar204._4_4_ * 3.0;
                auVar220._8_4_ = auVar204._8_4_ * 3.0;
                auVar220._12_4_ = auVar204._12_4_ * 3.0;
                auVar204 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar240,local_980._0_16_)
                ;
                auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_980._0_16_,auVar240);
                fVar106 = auVar240._0_4_ * 6.0;
                fVar130 = auVar204._0_4_ * 6.0;
                fVar131 = auVar8._0_4_ * 6.0;
                fVar132 = local_980._0_4_ * 6.0;
                auVar153._0_4_ = fVar132 * (float)local_a50._0_4_;
                auVar153._4_4_ = fVar132 * (float)local_a50._4_4_;
                auVar153._8_4_ = fVar132 * fStack_a48;
                auVar153._12_4_ = fVar132 * fStack_a44;
                auVar113._4_4_ = fVar131;
                auVar113._0_4_ = fVar131;
                auVar113._8_4_ = fVar131;
                auVar113._12_4_ = fVar131;
                auVar240 = vfmadd132ps_fma(auVar113,auVar153,local_a30);
                auVar154._4_4_ = fVar130;
                auVar154._0_4_ = fVar130;
                auVar154._8_4_ = fVar130;
                auVar154._12_4_ = fVar130;
                auVar240 = vfmadd132ps_fma(auVar154,auVar240,local_a40);
                auVar204 = vdpps_avx(auVar220,auVar220,0x7f);
                auVar114._4_4_ = fVar106;
                auVar114._0_4_ = fVar106;
                auVar114._8_4_ = fVar106;
                auVar114._12_4_ = fVar106;
                auVar9 = vfmadd132ps_fma(auVar114,auVar240,local_a20);
                auVar240 = vblendps_avx(auVar204,_DAT_01f7aa10,0xe);
                auVar8 = vrsqrtss_avx(auVar240,auVar240);
                fVar131 = auVar204._0_4_;
                fVar106 = auVar8._0_4_;
                auVar8 = vdpps_avx(auVar220,auVar9,0x7f);
                fVar106 = fVar106 * 1.5 + fVar131 * -0.5 * fVar106 * fVar106 * fVar106;
                auVar115._0_4_ = auVar9._0_4_ * fVar131;
                auVar115._4_4_ = auVar9._4_4_ * fVar131;
                auVar115._8_4_ = auVar9._8_4_ * fVar131;
                auVar115._12_4_ = auVar9._12_4_ * fVar131;
                fVar130 = auVar8._0_4_;
                auVar205._0_4_ = auVar220._0_4_ * fVar130;
                auVar205._4_4_ = auVar220._4_4_ * fVar130;
                auVar205._8_4_ = auVar220._8_4_ * fVar130;
                auVar205._12_4_ = auVar220._12_4_ * fVar130;
                auVar8 = vsubps_avx(auVar115,auVar205);
                auVar240 = vrcpss_avx(auVar240,auVar240);
                auVar9 = vfnmadd213ss_fma(auVar240,auVar204,ZEXT416(0x40000000));
                fVar130 = auVar240._0_4_ * auVar9._0_4_;
                auVar240 = vmaxss_avx(ZEXT416((uint)local_960._0_4_),
                                      ZEXT416((uint)(fVar133 * (float)local_720._0_4_)));
                auVar249 = ZEXT1664(auVar240);
                uVar73 = CONCAT44(auVar220._4_4_,auVar220._0_4_);
                local_ac0._0_8_ = uVar73 ^ 0x8000000080000000;
                local_ac0._8_4_ = -auVar220._8_4_;
                local_ac0._12_4_ = -auVar220._12_4_;
                auVar155._0_4_ = fVar106 * auVar8._0_4_ * fVar130;
                auVar155._4_4_ = fVar106 * auVar8._4_4_ * fVar130;
                auVar155._8_4_ = fVar106 * auVar8._8_4_ * fVar130;
                auVar155._12_4_ = fVar106 * auVar8._12_4_ * fVar130;
                local_8e0._0_4_ = auVar220._0_4_ * fVar106;
                local_8e0._4_4_ = auVar220._4_4_ * fVar106;
                local_8e0._8_4_ = auVar220._8_4_ * fVar106;
                local_8e0._12_4_ = auVar220._12_4_ * fVar106;
                local_980._0_16_ = auVar220;
                local_9a0._0_4_ = auVar240._0_4_;
                if (fVar131 < -fVar131) {
                  local_aa0._0_4_ = auVar88._0_4_;
                  local_900._0_16_ = auVar155;
                  fVar106 = sqrtf(fVar131);
                  auVar88 = ZEXT416((uint)local_aa0._0_4_);
                  auVar249 = ZEXT464((uint)local_9a0._0_4_);
                  auVar155 = local_900._0_16_;
                }
                else {
                  auVar240 = vsqrtss_avx(auVar204,auVar204);
                  fVar106 = auVar240._0_4_;
                }
                auVar240 = vdpps_avx(_local_8c0,local_8e0._0_16_,0x7f);
                auVar82 = vfmadd213ss_fma(ZEXT416((uint)local_960._0_4_),auVar88,auVar249._0_16_);
                auVar204 = vdpps_avx(local_ac0._0_16_,local_8e0._0_16_,0x7f);
                auVar8 = vdpps_avx(_local_8c0,auVar155,0x7f);
                auVar9 = vdpps_avx(local_9c0._0_16_,local_8e0._0_16_,0x7f);
                auVar88 = vfmadd213ss_fma(ZEXT416((uint)(auVar88._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_960._0_4_ / fVar106)),auVar82)
                ;
                local_aa0._0_4_ = auVar88._0_4_;
                auVar85._0_4_ = auVar240._0_4_ * auVar240._0_4_;
                auVar85._4_4_ = auVar240._4_4_ * auVar240._4_4_;
                auVar85._8_4_ = auVar240._8_4_ * auVar240._8_4_;
                auVar85._12_4_ = auVar240._12_4_ * auVar240._12_4_;
                auVar88 = vdpps_avx(_local_8c0,local_ac0._0_16_,0x7f);
                auVar81 = vsubps_avx(local_ae0._0_16_,auVar85);
                auVar82 = vrsqrtss_avx(auVar81,auVar81);
                fVar130 = auVar81._0_4_;
                fVar106 = auVar82._0_4_;
                fVar106 = fVar106 * 1.5 + fVar130 * -0.5 * fVar106 * fVar106 * fVar106;
                auVar82 = vdpps_avx(_local_8c0,local_9c0._0_16_,0x7f);
                local_ac0._0_16_ = ZEXT416((uint)(auVar204._0_4_ + auVar8._0_4_));
                local_8e0._0_16_ = vfnmadd231ss_fma(auVar88,auVar240,local_ac0._0_16_);
                auVar88 = vfnmadd231ss_fma(auVar82,auVar240,auVar9);
                if (fVar130 < 0.0) {
                  local_900._0_16_ = auVar240;
                  local_8a0._0_16_ = auVar9;
                  local_740._0_4_ = fVar106;
                  local_760._0_16_ = auVar88;
                  fVar130 = sqrtf(fVar130);
                  auVar249 = ZEXT464((uint)local_9a0._0_4_);
                  fVar106 = (float)local_740._0_4_;
                  auVar88 = local_760._0_16_;
                  auVar9 = local_8a0._0_16_;
                  auVar240 = local_900._0_16_;
                }
                else {
                  auVar204 = vsqrtss_avx(auVar81,auVar81);
                  fVar130 = auVar204._0_4_;
                }
                auVar242 = ZEXT3264(local_b00);
                auVar204 = vpermilps_avx(local_700._0_16_,0xff);
                fVar130 = fVar130 - auVar204._0_4_;
                auVar8 = vshufps_avx(local_980._0_16_,local_980._0_16_,0xff);
                auVar204 = vfmsub213ss_fma(local_8e0._0_16_,ZEXT416((uint)fVar106),auVar8);
                auVar156._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
                auVar156._8_4_ = auVar9._8_4_ ^ 0x80000000;
                auVar156._12_4_ = auVar9._12_4_ ^ 0x80000000;
                auVar183._0_8_ = auVar204._0_8_ ^ 0x8000000080000000;
                auVar183._8_4_ = auVar204._8_4_ ^ 0x80000000;
                auVar183._12_4_ = auVar204._12_4_ ^ 0x80000000;
                auVar88 = ZEXT416((uint)(auVar88._0_4_ * fVar106));
                auVar204 = vfmsub231ss_fma(ZEXT416((uint)(auVar9._0_4_ * auVar204._0_4_)),
                                           local_ac0._0_16_,auVar88);
                auVar88 = vinsertps_avx(auVar183,auVar88,0x1c);
                uVar77 = auVar204._0_4_;
                auVar184._4_4_ = uVar77;
                auVar184._0_4_ = uVar77;
                auVar184._8_4_ = uVar77;
                auVar184._12_4_ = uVar77;
                auVar88 = vdivps_avx(auVar88,auVar184);
                auVar204 = vinsertps_avx(local_ac0._0_16_,auVar156,0x10);
                auVar204 = vdivps_avx(auVar204,auVar184);
                fVar106 = auVar240._0_4_;
                auVar139._0_4_ = fVar106 * auVar88._0_4_ + fVar130 * auVar204._0_4_;
                auVar139._4_4_ = fVar106 * auVar88._4_4_ + fVar130 * auVar204._4_4_;
                auVar139._8_4_ = fVar106 * auVar88._8_4_ + fVar130 * auVar204._8_4_;
                auVar139._12_4_ = fVar106 * auVar88._12_4_ + fVar130 * auVar204._12_4_;
                auVar137 = vsubps_avx(auVar137,auVar139);
                auVar88 = vandps_avx(auVar240,local_a60);
                if (auVar88._0_4_ < (float)local_aa0._0_4_) {
                  auVar240 = vfmadd231ss_fma(ZEXT416((uint)(auVar249._0_4_ + (float)local_aa0._0_4_)
                                                    ),local_780._0_16_,ZEXT416(0x36000000));
                  auVar88 = vandps_avx(ZEXT416((uint)fVar130),local_a60);
                  if (auVar88._0_4_ < auVar240._0_4_) {
                    fVar106 = auVar137._0_4_ + (float)local_850._0_4_;
                    bVar66 = 0;
                    if (((ray->org).field_0.m128[3] <= fVar106) &&
                       (fVar130 = ray->tfar, fVar106 <= fVar130)) {
                      auVar137 = vmovshdup_avx(auVar137);
                      bVar66 = 0;
                      fVar131 = auVar137._0_4_;
                      if ((0.0 <= fVar131) && (fVar131 <= 1.0)) {
                        auVar137 = vrsqrtss_avx(local_ae0._0_16_,local_ae0._0_16_);
                        fVar132 = auVar137._0_4_;
                        pGVar5 = (context->scene->geometries).items[uVar72].ptr;
                        if ((pGVar5->mask & ray->mask) == 0) {
                          bVar66 = 0;
                        }
                        else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                (bVar66 = 1, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          fVar132 = fVar132 * 1.5 +
                                    local_ae0._0_4_ * -0.5 * fVar132 * fVar132 * fVar132;
                          auVar157._0_4_ = fVar132 * (float)local_8c0._0_4_;
                          auVar157._4_4_ = fVar132 * (float)local_8c0._4_4_;
                          auVar157._8_4_ = fVar132 * fStack_8b8;
                          auVar157._12_4_ = fVar132 * fStack_8b4;
                          auVar204 = vfmadd213ps_fma(auVar8,auVar157,local_980._0_16_);
                          auVar137 = vshufps_avx(auVar157,auVar157,0xc9);
                          auVar88 = vshufps_avx(local_980._0_16_,local_980._0_16_,0xc9);
                          auVar158._0_4_ = auVar157._0_4_ * auVar88._0_4_;
                          auVar158._4_4_ = auVar157._4_4_ * auVar88._4_4_;
                          auVar158._8_4_ = auVar157._8_4_ * auVar88._8_4_;
                          auVar158._12_4_ = auVar157._12_4_ * auVar88._12_4_;
                          auVar240 = vfmsub231ps_fma(auVar158,local_980._0_16_,auVar137);
                          auVar137 = vshufps_avx(auVar240,auVar240,0xc9);
                          auVar88 = vshufps_avx(auVar204,auVar204,0xc9);
                          auVar240 = vshufps_avx(auVar240,auVar240,0xd2);
                          auVar86._0_4_ = auVar204._0_4_ * auVar240._0_4_;
                          auVar86._4_4_ = auVar204._4_4_ * auVar240._4_4_;
                          auVar86._8_4_ = auVar204._8_4_ * auVar240._8_4_;
                          auVar86._12_4_ = auVar204._12_4_ * auVar240._12_4_;
                          auVar88 = vfmsub231ps_fma(auVar86,auVar137,auVar88);
                          auVar137 = vshufps_avx(auVar88,auVar88,0xe9);
                          local_930 = vmovlps_avx(auVar137);
                          local_928 = auVar88._0_4_;
                          local_920 = 0;
                          local_914 = context->user->instID[0];
                          local_910 = context->user->instPrimID[0];
                          ray->tfar = fVar106;
                          local_6e0._0_4_ = 0xffffffff;
                          local_a10.valid = (int *)local_6e0;
                          local_a10.geometryUserPtr = pGVar5->userPtr;
                          local_a10.context = context->user;
                          local_a10.hit = (RTCHitN *)&local_930;
                          local_a10.N = 1;
                          local_a10.ray = (RTCRayN *)ray;
                          local_924 = fVar131;
                          local_91c = uVar1;
                          local_918 = uVar72;
                          if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01589ecc:
                            p_Var6 = context->args->filter;
                            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar242 = ZEXT1664(auVar242._0_16_);
                              (*p_Var6)(&local_a10);
                              if (*local_a10.valid == 0) goto LAB_01589f0f;
                            }
                            bVar66 = 1;
                          }
                          else {
                            auVar242 = ZEXT1664(local_b00._0_16_);
                            (*pGVar5->occlusionFilterN)(&local_a10);
                            if (*local_a10.valid != 0) goto LAB_01589ecc;
LAB_01589f0f:
                            ray->tfar = fVar130;
                            bVar66 = 0;
                          }
                        }
                      }
                    }
                    goto LAB_01589cbe;
                  }
                }
                bVar76 = uVar74 < 4;
                uVar74 = uVar74 + 1;
              } while (uVar74 != 5);
              bVar76 = false;
              bVar66 = 5;
LAB_01589cbe:
              bVar75 = (bool)(bVar75 | bVar76 & bVar66);
              fVar106 = ray->tfar;
              auVar98._4_4_ = fVar106;
              auVar98._0_4_ = fVar106;
              auVar98._8_4_ = fVar106;
              auVar98._12_4_ = fVar106;
              auVar98._16_4_ = fVar106;
              auVar98._20_4_ = fVar106;
              auVar98._24_4_ = fVar106;
              auVar98._28_4_ = fVar106;
              auVar256 = vcmpps_avx(_local_9e0,auVar98,2);
              auVar93 = vandps_avx(auVar256,local_500);
              auVar128 = ZEXT3264(auVar93);
              auVar256 = local_500 & auVar256;
              local_500 = auVar93;
            } while ((((((((auVar256 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar256 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar256 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar256 >> 0x7f,0) != '\0') ||
                       (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar256 >> 0xbf,0) != '\0') ||
                     (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar256[0x1f] < '\0');
            auVar238 = ZEXT3264(local_5e0);
            auVar249 = ZEXT3264(local_600);
            auVar93 = local_640;
            fVar106 = (float)local_620._0_4_;
            fVar130 = (float)local_620._4_4_;
            fVar131 = fStack_618;
            fVar132 = fStack_614;
            fVar135 = fStack_610;
            fVar133 = fStack_60c;
            fVar134 = fStack_608;
          }
          auVar129._0_4_ = fVar106 * (float)local_820._0_4_;
          auVar129._4_4_ = fVar130 * (float)local_820._4_4_;
          auVar129._8_4_ = fVar131 * fStack_818;
          auVar129._12_4_ = fVar132 * fStack_814;
          auVar129._16_4_ = fVar135 * fStack_810;
          auVar129._20_4_ = fVar133 * fStack_80c;
          auVar129._28_36_ = auVar128._28_36_;
          auVar129._24_4_ = fVar134 * fStack_808;
          auVar137 = vfmadd213ps_fma(local_800,auVar249._0_32_,auVar129._0_32_);
          auVar137 = vfmadd213ps_fma(_local_7e0,auVar238._0_32_,ZEXT1632(auVar137));
          auVar58._4_4_ = uStack_7bc;
          auVar58._0_4_ = local_7c0;
          auVar58._8_4_ = uStack_7b8;
          auVar58._12_4_ = uStack_7b4;
          auVar58._16_4_ = uStack_7b0;
          auVar58._20_4_ = uStack_7ac;
          auVar58._24_4_ = uStack_7a8;
          auVar58._28_4_ = uStack_7a4;
          auVar256 = vandps_avx(ZEXT1632(auVar137),auVar58);
          auVar146._8_4_ = 0x3e99999a;
          auVar146._0_8_ = 0x3e99999a3e99999a;
          auVar146._12_4_ = 0x3e99999a;
          auVar146._16_4_ = 0x3e99999a;
          auVar146._20_4_ = 0x3e99999a;
          auVar146._24_4_ = 0x3e99999a;
          auVar146._28_4_ = 0x3e99999a;
          auVar256 = vcmpps_avx(auVar256,auVar146,1);
          auVar256 = vorps_avx(auVar256,auVar93);
          auVar147._0_4_ = (float)local_880._0_4_ + local_6c0._0_4_;
          auVar147._4_4_ = (float)local_880._4_4_ + local_6c0._4_4_;
          auVar147._8_4_ = fStack_878 + local_6c0._8_4_;
          auVar147._12_4_ = fStack_874 + local_6c0._12_4_;
          auVar147._16_4_ = fStack_870 + local_6c0._16_4_;
          auVar147._20_4_ = fStack_86c + local_6c0._20_4_;
          auVar147._24_4_ = fStack_868 + local_6c0._24_4_;
          auVar147._28_4_ = fStack_864 + local_6c0._28_4_;
          auVar93 = vcmpps_avx(auVar147,auVar98,2);
          local_800 = vandps_avx(auVar93,local_5a0);
          auVar148._8_4_ = 3;
          auVar148._0_8_ = 0x300000003;
          auVar148._12_4_ = 3;
          auVar148._16_4_ = 3;
          auVar148._20_4_ = 3;
          auVar148._24_4_ = 3;
          auVar148._28_4_ = 3;
          auVar173._8_4_ = 2;
          auVar173._0_8_ = 0x200000002;
          auVar173._12_4_ = 2;
          auVar173._16_4_ = 2;
          auVar173._20_4_ = 2;
          auVar173._24_4_ = 2;
          auVar173._28_4_ = 2;
          auVar93 = vblendvps_avx(auVar173,auVar148,auVar256);
          _local_820 = vpcmpgtd_avx2(auVar93,local_5c0);
          auVar93 = vpandn_avx2(_local_820,local_800);
          auVar256 = local_800 & ~_local_820;
          local_6e0 = auVar93;
          if ((((((((auVar256 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar256 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar256 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar256 >> 0x7f,0) != '\0') ||
                (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar256 >> 0xbf,0) != '\0') ||
              (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar256[0x1f] < '\0') {
            auVar88 = vminps_avx(local_a20,local_a40);
            auVar137 = vmaxps_avx(local_a20,local_a40);
            auVar240 = vminps_avx(local_a30,_local_a50);
            auVar204 = vminps_avx(auVar88,auVar240);
            auVar88 = vmaxps_avx(local_a30,_local_a50);
            auVar128 = ZEXT3264(local_4c0);
            auVar240 = vmaxps_avx(auVar137,auVar88);
            auVar137 = vandps_avx(auVar204,local_a60);
            auVar88 = vandps_avx(auVar240,local_a60);
            auVar137 = vmaxps_avx(auVar137,auVar88);
            auVar88 = vmovshdup_avx(auVar137);
            auVar88 = vmaxss_avx(auVar88,auVar137);
            auVar137 = vshufpd_avx(auVar137,auVar137,1);
            auVar137 = vmaxss_avx(auVar137,auVar88);
            local_960._0_4_ = auVar137._0_4_ * 1.9073486e-06;
            local_780._0_16_ = vshufps_avx(auVar240,auVar240,0xff);
            local_7e0._4_4_ = (float)local_880._4_4_ + local_4c0._4_4_;
            local_7e0._0_4_ = (float)local_880._0_4_ + local_4c0._0_4_;
            fStack_7d8 = fStack_878 + local_4c0._8_4_;
            fStack_7d4 = fStack_874 + local_4c0._12_4_;
            fStack_7d0 = fStack_870 + local_4c0._16_4_;
            fStack_7cc = fStack_86c + local_4c0._20_4_;
            fStack_7c8 = fStack_868 + local_4c0._24_4_;
            fStack_7c4 = fStack_864 + local_4c0._28_4_;
            _local_9e0 = local_4c0;
            do {
              auVar100._8_4_ = 0x7f800000;
              auVar100._0_8_ = 0x7f8000007f800000;
              auVar100._12_4_ = 0x7f800000;
              auVar100._16_4_ = 0x7f800000;
              auVar100._20_4_ = 0x7f800000;
              auVar100._24_4_ = 0x7f800000;
              auVar100._28_4_ = 0x7f800000;
              auVar256 = vblendvps_avx(auVar100,auVar128._0_32_,auVar93);
              auVar143 = vshufps_avx(auVar256,auVar256,0xb1);
              auVar143 = vminps_avx(auVar256,auVar143);
              auVar12 = vshufpd_avx(auVar143,auVar143,5);
              auVar143 = vminps_avx(auVar143,auVar12);
              auVar12 = vpermpd_avx2(auVar143,0x4e);
              auVar143 = vminps_avx(auVar143,auVar12);
              auVar143 = vcmpps_avx(auVar256,auVar143,0);
              auVar12 = auVar93 & auVar143;
              auVar256 = auVar93;
              if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar12 >> 0x7f,0) != '\0') ||
                    (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar12 >> 0xbf,0) != '\0') ||
                  (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar12[0x1f] < '\0') {
                auVar256 = vandps_avx(auVar143,auVar93);
              }
              uVar68 = vmovmskps_avx(auVar256);
              iVar21 = 0;
              for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
                iVar21 = iVar21 + 1;
              }
              uVar69 = iVar21 << 2;
              local_6e0 = auVar93;
              *(undefined4 *)(local_6e0 + uVar69) = 0;
              aVar2 = (ray->dir).field_0;
              local_9c0._0_16_ = (undefined1  [16])aVar2;
              auVar137 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
              uVar68 = *(uint *)(local_1c0 + uVar69);
              if (auVar137._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416(*(uint *)(local_4a0 + uVar69));
                fVar106 = sqrtf(auVar137._0_4_);
                auVar137 = local_ae0._0_16_;
              }
              else {
                auVar137 = vsqrtss_avx(auVar137,auVar137);
                fVar106 = auVar137._0_4_;
                auVar137 = ZEXT416(*(uint *)(local_4a0 + uVar69));
              }
              local_720._0_4_ = fVar106 * 1.9073486e-06;
              auVar137 = vinsertps_avx(auVar137,ZEXT416(uVar68),0x10);
              bVar76 = true;
              uVar74 = 0;
              do {
                local_980._0_16_ = vmovshdup_avx(auVar137);
                fVar135 = 1.0 - local_980._0_4_;
                auVar88 = vshufps_avx(auVar137,auVar137,0x55);
                fVar106 = auVar88._0_4_;
                auVar116._0_4_ = local_a40._0_4_ * fVar106;
                fVar130 = auVar88._4_4_;
                auVar116._4_4_ = local_a40._4_4_ * fVar130;
                fVar131 = auVar88._8_4_;
                auVar116._8_4_ = local_a40._8_4_ * fVar131;
                fVar132 = auVar88._12_4_;
                auVar116._12_4_ = local_a40._12_4_ * fVar132;
                auVar140._4_4_ = fVar135;
                auVar140._0_4_ = fVar135;
                auVar140._8_4_ = fVar135;
                auVar140._12_4_ = fVar135;
                auVar88 = vfmadd231ps_fma(auVar116,auVar140,local_a20);
                auVar159._0_4_ = local_a30._0_4_ * fVar106;
                auVar159._4_4_ = local_a30._4_4_ * fVar130;
                auVar159._8_4_ = local_a30._8_4_ * fVar131;
                auVar159._12_4_ = local_a30._12_4_ * fVar132;
                auVar240 = vfmadd231ps_fma(auVar159,auVar140,local_a40);
                auVar206._0_4_ = fVar106 * auVar240._0_4_;
                auVar206._4_4_ = fVar130 * auVar240._4_4_;
                auVar206._8_4_ = fVar131 * auVar240._8_4_;
                auVar206._12_4_ = fVar132 * auVar240._12_4_;
                auVar204 = vfmadd231ps_fma(auVar206,auVar140,auVar88);
                auVar117._0_4_ = fVar106 * (float)local_a50._0_4_;
                auVar117._4_4_ = fVar130 * (float)local_a50._4_4_;
                auVar117._8_4_ = fVar131 * fStack_a48;
                auVar117._12_4_ = fVar132 * fStack_a44;
                auVar88 = vfmadd231ps_fma(auVar117,auVar140,local_a30);
                auVar185._0_4_ = fVar106 * auVar88._0_4_;
                auVar185._4_4_ = fVar130 * auVar88._4_4_;
                auVar185._8_4_ = fVar131 * auVar88._8_4_;
                auVar185._12_4_ = fVar132 * auVar88._12_4_;
                local_ac0._0_16_ = vfmadd231ps_fma(auVar185,auVar140,auVar240);
                fVar133 = auVar137._0_4_;
                auVar118._4_4_ = fVar133;
                auVar118._0_4_ = fVar133;
                auVar118._8_4_ = fVar133;
                auVar118._12_4_ = fVar133;
                auVar88 = vfmadd213ps_fma(auVar118,local_9c0._0_16_,_DAT_01f7aa10);
                auVar87._0_4_ = fVar106 * local_ac0._0_4_;
                auVar87._4_4_ = fVar130 * local_ac0._4_4_;
                auVar87._8_4_ = fVar131 * local_ac0._8_4_;
                auVar87._12_4_ = fVar132 * local_ac0._12_4_;
                auVar240 = vfmadd231ps_fma(auVar87,auVar204,auVar140);
                local_700._0_16_ = auVar240;
                auVar88 = vsubps_avx(auVar88,auVar240);
                _local_8c0 = auVar88;
                auVar88 = vdpps_avx(auVar88,auVar88,0x7f);
                local_ae0._0_16_ = auVar88;
                if (auVar88._0_4_ < 0.0) {
                  local_9a0._0_16_ = ZEXT416((uint)fVar135);
                  local_aa0._0_16_ = auVar204;
                  auVar105._0_4_ = sqrtf(auVar88._0_4_);
                  auVar105._4_60_ = extraout_var_00;
                  auVar88 = auVar105._0_16_;
                  auVar204 = local_aa0._0_16_;
                  auVar240 = local_9a0._0_16_;
                }
                else {
                  auVar88 = vsqrtss_avx(auVar88,auVar88);
                  auVar240 = ZEXT416((uint)fVar135);
                }
                auVar204 = vsubps_avx(local_ac0._0_16_,auVar204);
                auVar221._0_4_ = auVar204._0_4_ * 3.0;
                auVar221._4_4_ = auVar204._4_4_ * 3.0;
                auVar221._8_4_ = auVar204._8_4_ * 3.0;
                auVar221._12_4_ = auVar204._12_4_ * 3.0;
                auVar204 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar240,local_980._0_16_)
                ;
                auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_980._0_16_,auVar240);
                fVar106 = auVar240._0_4_ * 6.0;
                fVar130 = auVar204._0_4_ * 6.0;
                fVar131 = auVar8._0_4_ * 6.0;
                fVar132 = local_980._0_4_ * 6.0;
                auVar160._0_4_ = fVar132 * (float)local_a50._0_4_;
                auVar160._4_4_ = fVar132 * (float)local_a50._4_4_;
                auVar160._8_4_ = fVar132 * fStack_a48;
                auVar160._12_4_ = fVar132 * fStack_a44;
                auVar119._4_4_ = fVar131;
                auVar119._0_4_ = fVar131;
                auVar119._8_4_ = fVar131;
                auVar119._12_4_ = fVar131;
                auVar240 = vfmadd132ps_fma(auVar119,auVar160,local_a30);
                auVar161._4_4_ = fVar130;
                auVar161._0_4_ = fVar130;
                auVar161._8_4_ = fVar130;
                auVar161._12_4_ = fVar130;
                auVar240 = vfmadd132ps_fma(auVar161,auVar240,local_a40);
                auVar204 = vdpps_avx(auVar221,auVar221,0x7f);
                auVar120._4_4_ = fVar106;
                auVar120._0_4_ = fVar106;
                auVar120._8_4_ = fVar106;
                auVar120._12_4_ = fVar106;
                auVar9 = vfmadd132ps_fma(auVar120,auVar240,local_a20);
                auVar240 = vblendps_avx(auVar204,_DAT_01f7aa10,0xe);
                auVar8 = vrsqrtss_avx(auVar240,auVar240);
                fVar131 = auVar204._0_4_;
                fVar106 = auVar8._0_4_;
                auVar8 = vdpps_avx(auVar221,auVar9,0x7f);
                fVar106 = fVar106 * 1.5 + fVar131 * -0.5 * fVar106 * fVar106 * fVar106;
                auVar121._0_4_ = auVar9._0_4_ * fVar131;
                auVar121._4_4_ = auVar9._4_4_ * fVar131;
                auVar121._8_4_ = auVar9._8_4_ * fVar131;
                auVar121._12_4_ = auVar9._12_4_ * fVar131;
                fVar130 = auVar8._0_4_;
                auVar207._0_4_ = auVar221._0_4_ * fVar130;
                auVar207._4_4_ = auVar221._4_4_ * fVar130;
                auVar207._8_4_ = auVar221._8_4_ * fVar130;
                auVar207._12_4_ = auVar221._12_4_ * fVar130;
                auVar8 = vsubps_avx(auVar121,auVar207);
                auVar240 = vrcpss_avx(auVar240,auVar240);
                auVar9 = vfnmadd213ss_fma(auVar240,auVar204,ZEXT416(0x40000000));
                fVar130 = auVar240._0_4_ * auVar9._0_4_;
                auVar240 = vmaxss_avx(ZEXT416((uint)local_960._0_4_),
                                      ZEXT416((uint)(fVar133 * (float)local_720._0_4_)));
                auVar249 = ZEXT1664(auVar240);
                uVar73 = CONCAT44(auVar221._4_4_,auVar221._0_4_);
                local_ac0._0_8_ = uVar73 ^ 0x8000000080000000;
                local_ac0._8_4_ = -auVar221._8_4_;
                local_ac0._12_4_ = -auVar221._12_4_;
                auVar162._0_4_ = fVar106 * auVar8._0_4_ * fVar130;
                auVar162._4_4_ = fVar106 * auVar8._4_4_ * fVar130;
                auVar162._8_4_ = fVar106 * auVar8._8_4_ * fVar130;
                auVar162._12_4_ = fVar106 * auVar8._12_4_ * fVar130;
                local_8e0._0_4_ = auVar221._0_4_ * fVar106;
                local_8e0._4_4_ = auVar221._4_4_ * fVar106;
                local_8e0._8_4_ = auVar221._8_4_ * fVar106;
                local_8e0._12_4_ = auVar221._12_4_ * fVar106;
                local_980._0_16_ = auVar221;
                local_9a0._0_4_ = auVar240._0_4_;
                if (fVar131 < -fVar131) {
                  local_aa0._0_4_ = auVar88._0_4_;
                  local_900._0_16_ = auVar162;
                  fVar106 = sqrtf(fVar131);
                  auVar88 = ZEXT416((uint)local_aa0._0_4_);
                  auVar249 = ZEXT464((uint)local_9a0._0_4_);
                  auVar162 = local_900._0_16_;
                  auVar240 = local_8e0._0_16_;
                }
                else {
                  auVar240 = vsqrtss_avx(auVar204,auVar204);
                  fVar106 = auVar240._0_4_;
                  auVar240 = local_8e0._0_16_;
                }
                auVar242 = ZEXT1664(auVar240);
                auVar204 = vdpps_avx(_local_8c0,auVar240,0x7f);
                auVar81 = vfmadd213ss_fma(ZEXT416((uint)local_960._0_4_),auVar88,auVar249._0_16_);
                auVar8 = vdpps_avx(local_ac0._0_16_,auVar240,0x7f);
                auVar9 = vdpps_avx(_local_8c0,auVar162,0x7f);
                auVar82 = vdpps_avx(local_9c0._0_16_,auVar240,0x7f);
                auVar88 = vfmadd213ss_fma(ZEXT416((uint)(auVar88._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_960._0_4_ / fVar106)),auVar81)
                ;
                local_aa0._0_4_ = auVar88._0_4_;
                auVar89._0_4_ = auVar204._0_4_ * auVar204._0_4_;
                auVar89._4_4_ = auVar204._4_4_ * auVar204._4_4_;
                auVar89._8_4_ = auVar204._8_4_ * auVar204._8_4_;
                auVar89._12_4_ = auVar204._12_4_ * auVar204._12_4_;
                auVar88 = vdpps_avx(_local_8c0,local_ac0._0_16_,0x7f);
                auVar136 = vsubps_avx(local_ae0._0_16_,auVar89);
                auVar81 = vrsqrtss_avx(auVar136,auVar136);
                fVar130 = auVar136._0_4_;
                fVar106 = auVar81._0_4_;
                fVar106 = fVar106 * 1.5 + fVar130 * -0.5 * fVar106 * fVar106 * fVar106;
                auVar81 = vdpps_avx(_local_8c0,local_9c0._0_16_,0x7f);
                local_ac0._0_16_ = ZEXT416((uint)(auVar8._0_4_ + auVar9._0_4_));
                local_8e0._0_16_ = vfnmadd231ss_fma(auVar88,auVar204,local_ac0._0_16_);
                auVar88 = vfnmadd231ss_fma(auVar81,auVar204,auVar82);
                if (fVar130 < 0.0) {
                  local_900._0_16_ = auVar204;
                  local_8a0._0_16_ = auVar82;
                  local_740._0_4_ = fVar106;
                  local_760._0_16_ = auVar88;
                  auVar242 = ZEXT1664(auVar240);
                  fVar130 = sqrtf(fVar130);
                  auVar249 = ZEXT464((uint)local_9a0._0_4_);
                  fVar106 = (float)local_740._0_4_;
                  auVar88 = local_760._0_16_;
                  auVar82 = local_8a0._0_16_;
                  auVar204 = local_900._0_16_;
                }
                else {
                  auVar240 = vsqrtss_avx(auVar136,auVar136);
                  fVar130 = auVar240._0_4_;
                }
                auVar238 = ZEXT1664(local_ae0._0_16_);
                auVar240 = vpermilps_avx(local_700._0_16_,0xff);
                fVar130 = fVar130 - auVar240._0_4_;
                auVar8 = vshufps_avx(local_980._0_16_,local_980._0_16_,0xff);
                auVar240 = vfmsub213ss_fma(local_8e0._0_16_,ZEXT416((uint)fVar106),auVar8);
                auVar163._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
                auVar163._8_4_ = auVar82._8_4_ ^ 0x80000000;
                auVar163._12_4_ = auVar82._12_4_ ^ 0x80000000;
                auVar186._0_8_ = auVar240._0_8_ ^ 0x8000000080000000;
                auVar186._8_4_ = auVar240._8_4_ ^ 0x80000000;
                auVar186._12_4_ = auVar240._12_4_ ^ 0x80000000;
                auVar88 = ZEXT416((uint)(auVar88._0_4_ * fVar106));
                auVar240 = vfmsub231ss_fma(ZEXT416((uint)(auVar82._0_4_ * auVar240._0_4_)),
                                           local_ac0._0_16_,auVar88);
                auVar88 = vinsertps_avx(auVar186,auVar88,0x1c);
                uVar77 = auVar240._0_4_;
                auVar187._4_4_ = uVar77;
                auVar187._0_4_ = uVar77;
                auVar187._8_4_ = uVar77;
                auVar187._12_4_ = uVar77;
                auVar88 = vdivps_avx(auVar88,auVar187);
                auVar240 = vinsertps_avx(local_ac0._0_16_,auVar163,0x10);
                auVar240 = vdivps_avx(auVar240,auVar187);
                fVar106 = auVar204._0_4_;
                auVar141._0_4_ = fVar106 * auVar88._0_4_ + fVar130 * auVar240._0_4_;
                auVar141._4_4_ = fVar106 * auVar88._4_4_ + fVar130 * auVar240._4_4_;
                auVar141._8_4_ = fVar106 * auVar88._8_4_ + fVar130 * auVar240._8_4_;
                auVar141._12_4_ = fVar106 * auVar88._12_4_ + fVar130 * auVar240._12_4_;
                auVar137 = vsubps_avx(auVar137,auVar141);
                auVar88 = vandps_avx(auVar204,local_a60);
                if (auVar88._0_4_ < (float)local_aa0._0_4_) {
                  auVar240 = vfmadd231ss_fma(ZEXT416((uint)(auVar249._0_4_ + (float)local_aa0._0_4_)
                                                    ),local_780._0_16_,ZEXT416(0x36000000));
                  auVar88 = vandps_avx(ZEXT416((uint)fVar130),local_a60);
                  if (auVar88._0_4_ < auVar240._0_4_) {
                    fVar106 = auVar137._0_4_ + (float)local_850._0_4_;
                    bVar66 = 0;
                    if (fVar106 < (ray->org).field_0.m128[3]) goto LAB_0158a64b;
                    fVar130 = ray->tfar;
                    auVar249 = ZEXT464((uint)fVar130);
                    auVar128 = ZEXT3264(_local_9e0);
                    bVar66 = 0;
                    if (fVar130 < fVar106) goto LAB_0158a64b;
                    auVar137 = vmovshdup_avx(auVar137);
                    bVar66 = 0;
                    fVar131 = auVar137._0_4_;
                    if (fVar131 < 0.0) goto LAB_0158a64b;
                    if (fVar131 <= 1.0) {
                      auVar137 = vrsqrtss_avx(local_ae0._0_16_,local_ae0._0_16_);
                      fVar132 = auVar137._0_4_;
                      pGVar5 = (context->scene->geometries).items[uVar72].ptr;
                      if ((pGVar5->mask & ray->mask) == 0) {
                        bVar66 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar66 = 1, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar132 = fVar132 * 1.5 +
                                  local_ae0._0_4_ * -0.5 * fVar132 * fVar132 * fVar132;
                        auVar164._0_4_ = fVar132 * (float)local_8c0._0_4_;
                        auVar164._4_4_ = fVar132 * (float)local_8c0._4_4_;
                        auVar164._8_4_ = fVar132 * fStack_8b8;
                        auVar164._12_4_ = fVar132 * fStack_8b4;
                        auVar204 = vfmadd213ps_fma(auVar8,auVar164,local_980._0_16_);
                        auVar137 = vshufps_avx(auVar164,auVar164,0xc9);
                        auVar88 = vshufps_avx(local_980._0_16_,local_980._0_16_,0xc9);
                        auVar165._0_4_ = auVar164._0_4_ * auVar88._0_4_;
                        auVar165._4_4_ = auVar164._4_4_ * auVar88._4_4_;
                        auVar165._8_4_ = auVar164._8_4_ * auVar88._8_4_;
                        auVar165._12_4_ = auVar164._12_4_ * auVar88._12_4_;
                        auVar240 = vfmsub231ps_fma(auVar165,local_980._0_16_,auVar137);
                        auVar137 = vshufps_avx(auVar240,auVar240,0xc9);
                        auVar88 = vshufps_avx(auVar204,auVar204,0xc9);
                        auVar240 = vshufps_avx(auVar240,auVar240,0xd2);
                        auVar90._0_4_ = auVar204._0_4_ * auVar240._0_4_;
                        auVar90._4_4_ = auVar204._4_4_ * auVar240._4_4_;
                        auVar90._8_4_ = auVar204._8_4_ * auVar240._8_4_;
                        auVar90._12_4_ = auVar204._12_4_ * auVar240._12_4_;
                        auVar88 = vfmsub231ps_fma(auVar90,auVar137,auVar88);
                        auVar137 = vshufps_avx(auVar88,auVar88,0xe9);
                        local_930 = vmovlps_avx(auVar137);
                        local_928 = auVar88._0_4_;
                        local_920 = 0;
                        local_914 = context->user->instID[0];
                        local_910 = context->user->instPrimID[0];
                        ray->tfar = fVar106;
                        local_b04 = -1;
                        local_a10.valid = &local_b04;
                        local_a10.geometryUserPtr = pGVar5->userPtr;
                        local_a10.context = context->user;
                        local_a10.hit = (RTCHitN *)&local_930;
                        local_a10.N = 1;
                        local_a10.ray = (RTCRayN *)ray;
                        local_924 = fVar131;
                        local_91c = uVar1;
                        local_918 = uVar72;
                        if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0158a860:
                          p_Var6 = context->args->filter;
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar238 = ZEXT1664(auVar238._0_16_);
                            auVar242 = ZEXT1664(auVar242._0_16_);
                            auVar249 = ZEXT1664(auVar249._0_16_);
                            (*p_Var6)(&local_a10);
                            if (*local_a10.valid == 0) goto LAB_0158a8ac;
                          }
                          bVar66 = 1;
                        }
                        else {
                          auVar238 = ZEXT1664(local_ae0._0_16_);
                          auVar242 = ZEXT1664(auVar242._0_16_);
                          auVar249 = ZEXT464((uint)fVar130);
                          (*pGVar5->occlusionFilterN)(&local_a10);
                          if (*local_a10.valid != 0) goto LAB_0158a860;
LAB_0158a8ac:
                          ray->tfar = fVar130;
                          bVar66 = 0;
                        }
                      }
                      auVar128 = ZEXT3264(_local_9e0);
                    }
                    goto LAB_0158a64f;
                  }
                }
                bVar76 = uVar74 < 4;
                uVar74 = uVar74 + 1;
              } while (uVar74 != 5);
              bVar76 = false;
              bVar66 = 5;
LAB_0158a64b:
              auVar128 = ZEXT3264(_local_9e0);
LAB_0158a64f:
              bVar75 = (bool)(bVar75 | bVar76 & bVar66);
              fVar106 = ray->tfar;
              auVar98._4_4_ = fVar106;
              auVar98._0_4_ = fVar106;
              auVar98._8_4_ = fVar106;
              auVar98._12_4_ = fVar106;
              auVar98._16_4_ = fVar106;
              auVar98._20_4_ = fVar106;
              auVar98._24_4_ = fVar106;
              auVar98._28_4_ = fVar106;
              auVar256 = vcmpps_avx(_local_7e0,auVar98,2);
              auVar93 = vandps_avx(auVar256,local_6e0);
              auVar256 = local_6e0 & auVar256;
              local_6e0 = auVar93;
            } while ((((((((auVar256 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar256 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar256 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar256 >> 0x7f,0) != '\0') ||
                       (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar256 >> 0xbf,0) != '\0') ||
                     (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar256[0x1f] < '\0');
          }
          auVar149._0_4_ = (float)local_880._0_4_ + local_480._0_4_;
          auVar149._4_4_ = (float)local_880._4_4_ + local_480._4_4_;
          auVar149._8_4_ = fStack_878 + local_480._8_4_;
          auVar149._12_4_ = fStack_874 + local_480._12_4_;
          auVar149._16_4_ = fStack_870 + local_480._16_4_;
          auVar149._20_4_ = fStack_86c + local_480._20_4_;
          auVar149._24_4_ = fStack_868 + local_480._24_4_;
          auVar149._28_4_ = fStack_864 + local_480._28_4_;
          auVar256 = vcmpps_avx(auVar149,auVar98,2);
          auVar93 = vandps_avx(local_580,local_560);
          auVar93 = vandps_avx(auVar256,auVar93);
          auVar174._0_4_ = (float)local_880._0_4_ + local_4c0._0_4_;
          auVar174._4_4_ = (float)local_880._4_4_ + local_4c0._4_4_;
          auVar174._8_4_ = fStack_878 + local_4c0._8_4_;
          auVar174._12_4_ = fStack_874 + local_4c0._12_4_;
          auVar174._16_4_ = fStack_870 + local_4c0._16_4_;
          auVar174._20_4_ = fStack_86c + local_4c0._20_4_;
          auVar174._24_4_ = fStack_868 + local_4c0._24_4_;
          auVar174._28_4_ = fStack_864 + local_4c0._28_4_;
          auVar143 = vcmpps_avx(auVar174,auVar98,2);
          auVar256 = vandps_avx(_local_820,local_800);
          auVar256 = vandps_avx(auVar143,auVar256);
          auVar256 = vorps_avx(auVar93,auVar256);
          if ((((((((auVar256 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar256 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar256 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar256 >> 0x7f,0) != '\0') ||
                (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar256 >> 0xbf,0) != '\0') ||
              (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar256[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar71 * 0x60) = auVar256;
            auVar93 = vblendvps_avx(local_4c0,local_480,auVar93);
            *(undefined1 (*) [32])(auStack_160 + uVar71 * 0x60) = auVar93;
            uVar78 = vmovlps_avx(local_4d0);
            (&uStack_140)[uVar71 * 0xc] = uVar78;
            aiStack_138[uVar71 * 0x18] = local_b54 + 1;
            iVar70 = iVar70 + 1;
          }
        }
      }
    }
    auVar143 = local_400;
    auVar256 = local_420;
    fVar106 = ray->tfar;
    if (iVar70 == 0) break;
    fVar130 = ray->tfar;
    auVar125._4_4_ = fVar130;
    auVar125._0_4_ = fVar130;
    auVar125._8_4_ = fVar130;
    auVar125._12_4_ = fVar130;
    auVar125._16_4_ = fVar130;
    auVar125._20_4_ = fVar130;
    auVar125._24_4_ = fVar130;
    auVar125._28_4_ = fVar130;
    uVar68 = -iVar70;
    pauVar67 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar70 - 1) * 0x60);
    fVar130 = (float)local_880._0_4_;
    fVar131 = (float)local_880._4_4_;
    fVar132 = fStack_878;
    fVar135 = fStack_874;
    fVar133 = fStack_870;
    fVar134 = fStack_86c;
    fVar197 = fStack_868;
    fVar214 = fStack_864;
    while( true ) {
      auVar93 = pauVar67[1];
      auVar150._0_4_ = fVar130 + auVar93._0_4_;
      auVar150._4_4_ = fVar131 + auVar93._4_4_;
      auVar150._8_4_ = fVar132 + auVar93._8_4_;
      auVar150._12_4_ = fVar135 + auVar93._12_4_;
      auVar150._16_4_ = fVar133 + auVar93._16_4_;
      auVar150._20_4_ = fVar134 + auVar93._20_4_;
      auVar150._24_4_ = fVar197 + auVar93._24_4_;
      auVar150._28_4_ = fVar214 + auVar93._28_4_;
      auVar236 = vcmpps_avx(auVar150,auVar125,2);
      auVar12 = vandps_avx(auVar236,*pauVar67);
      local_480 = auVar12;
      auVar236 = *pauVar67 & auVar236;
      if ((((((((auVar236 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar236 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar236 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar236 >> 0x7f,0) != '\0') ||
            (auVar236 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar236 >> 0xbf,0) != '\0') ||
          (auVar236 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar236[0x1f] < '\0') break;
      pauVar67 = pauVar67 + -3;
      uVar68 = uVar68 + 1;
      fVar130 = (float)local_880._0_4_;
      fVar131 = (float)local_880._4_4_;
      fVar132 = fStack_878;
      fVar135 = fStack_874;
      fVar133 = fStack_870;
      fVar134 = fStack_86c;
      fVar197 = fStack_868;
      fVar214 = fStack_864;
      if (uVar68 == 0) goto LAB_0158abad;
    }
    auVar101._8_4_ = 0x7f800000;
    auVar101._0_8_ = 0x7f8000007f800000;
    auVar101._12_4_ = 0x7f800000;
    auVar101._16_4_ = 0x7f800000;
    auVar101._20_4_ = 0x7f800000;
    auVar101._24_4_ = 0x7f800000;
    auVar101._28_4_ = 0x7f800000;
    auVar93 = vblendvps_avx(auVar101,auVar93,auVar12);
    auVar236 = vshufps_avx(auVar93,auVar93,0xb1);
    auVar236 = vminps_avx(auVar93,auVar236);
    auVar170 = vshufpd_avx(auVar236,auVar236,5);
    auVar236 = vminps_avx(auVar236,auVar170);
    auVar170 = vpermpd_avx2(auVar236,0x4e);
    auVar236 = vminps_avx(auVar236,auVar170);
    auVar93 = vcmpps_avx(auVar93,auVar236,0);
    auVar236 = auVar12 & auVar93;
    if ((((((((auVar236 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar236 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar236 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar236 >> 0x7f,0) != '\0') ||
          (auVar236 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar236 >> 0xbf,0) != '\0') ||
        (auVar236 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar236[0x1f] < '\0') {
      auVar12 = vandps_avx(auVar93,auVar12);
    }
    uVar74 = *(ulong *)pauVar67[2];
    auVar91._8_8_ = 0;
    auVar91._0_8_ = uVar74;
    uVar69 = vmovmskps_avx(auVar12);
    iVar70 = 0;
    for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x80000000) {
      iVar70 = iVar70 + 1;
    }
    *(undefined4 *)(local_480 + (uint)(iVar70 << 2)) = 0;
    uVar69 = ~uVar68;
    if ((((((((local_480 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_480 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_480 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_480 >> 0x7f,0) != '\0') ||
          (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_480 >> 0xbf,0) != '\0') ||
        (local_480 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_480[0x1f] < '\0') {
      uVar69 = -uVar68;
    }
    uVar71 = (ulong)uVar69;
    local_b54 = *(int *)(pauVar67[2] + 8);
    *pauVar67 = local_480;
    uVar77 = (undefined4)uVar74;
    auVar126._4_4_ = uVar77;
    auVar126._0_4_ = uVar77;
    auVar126._8_4_ = uVar77;
    auVar126._12_4_ = uVar77;
    auVar126._16_4_ = uVar77;
    auVar126._20_4_ = uVar77;
    auVar126._24_4_ = uVar77;
    auVar126._28_4_ = uVar77;
    auVar137 = vmovshdup_avx(auVar91);
    auVar137 = vsubps_avx(auVar137,auVar91);
    auVar102._0_4_ = auVar137._0_4_;
    auVar102._4_4_ = auVar102._0_4_;
    auVar102._8_4_ = auVar102._0_4_;
    auVar102._12_4_ = auVar102._0_4_;
    auVar102._16_4_ = auVar102._0_4_;
    auVar102._20_4_ = auVar102._0_4_;
    auVar102._24_4_ = auVar102._0_4_;
    auVar102._28_4_ = auVar102._0_4_;
    auVar137 = vfmadd132ps_fma(auVar102,auVar126,_DAT_01faff20);
    local_4c0 = ZEXT1632(auVar137);
    local_4d0._8_8_ = 0;
    local_4d0._0_8_ = *(ulong *)(local_4c0 + (uint)(iVar70 << 2));
  } while( true );
LAB_0158abad:
  if (bVar75 != false) {
    return bVar75;
  }
  auVar92._4_4_ = fVar106;
  auVar92._0_4_ = fVar106;
  auVar92._8_4_ = fVar106;
  auVar92._12_4_ = fVar106;
  auVar137 = vcmpps_avx(local_4e0,auVar92,2);
  uVar72 = vmovmskps_avx(auVar137);
  uVar72 = (uint)local_828 & uVar72;
  if (uVar72 == 0) {
    return false;
  }
  goto LAB_01588749;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }